

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O0

bool __thiscall FScanner::ScanString(FScanner *this,bool tokens)

{
  char cVar1;
  byte bVar2;
  uchar *puVar3;
  bool bVar4;
  byte *pbVar5;
  char *pcVar6;
  size_t sVar7;
  int iVar8;
  char *pcVar9;
  char *local_c8;
  FString local_90 [3];
  FString local_78;
  undefined1 local_69;
  uint local_68;
  uchar yych_4;
  uint yyaccept_3;
  uchar yych_3;
  uint yyaccept_2;
  uchar yych_2;
  uint yyaccept_1;
  uchar yych_1;
  uint yyaccept;
  uchar yych;
  char *limit;
  char *cursor;
  char *pcStack_30;
  bool return_val;
  char *tok;
  char *marker;
  FScanner *pFStack_18;
  bool tokens_local;
  FScanner *this_local;
  
  marker._7_1_ = tokens;
  pFStack_18 = this;
  CheckOpen(this);
  if ((this->AlreadyGot & 1U) != 0) {
    this->AlreadyGot = false;
    if (((marker._7_1_ & 1) == 0) || ((this->LastGotToken & 1U) != 0)) {
      return true;
    }
    this->ScriptPtr = this->LastGotPtr;
    this->Line = this->LastGotLine;
  }
  this->Crossed = false;
  if (this->ScriptEndPtr <= this->ScriptPtr) {
    this->End = true;
    return false;
  }
  this->LastGotPtr = this->ScriptPtr;
  this->LastGotLine = this->Line;
  limit = this->ScriptPtr;
  _yyaccept = this->ScriptEndPtr;
LAB_0064c6e3:
  pcVar6 = limit;
  pcStack_30 = limit;
  pbVar5 = (byte *)limit;
LAB_0064c6eb:
  limit = (char *)pbVar5;
  pcVar9 = limit;
  if (((marker._7_1_ & 1) != 0) && (this->StateMode != '\0')) {
    yyaccept_1 = 0;
    tok = limit;
    yych_1 = *limit;
    pbVar5 = (byte *)limit;
    if (0x4c < yych_1) {
      if (yych_1 < 0x6c) {
        if (0x57 < yych_1) {
          if (yych_1 < 0x66) goto LAB_0064c915;
          if (yych_1 < 0x67) goto LAB_0064cb41;
          if (0x67 < yych_1) goto LAB_0064c915;
          goto LAB_0064cb82;
        }
        if (yych_1 != 0x53) {
          if (yych_1 < 0x57) goto LAB_0064c915;
          goto LAB_0064cc45;
        }
      }
      else {
        if (0x76 < yych_1) {
          if (0x77 < yych_1) {
            if (yych_1 != 0x7d) goto LAB_0064c915;
            this->StateMode = '\0';
            this->StateOptions = false;
            this->TokenType = 0x7d;
            pbVar5 = (byte *)(limit + 1);
            goto LAB_0065871d;
          }
LAB_0064cc45:
          yyaccept_1 = 0;
          yych_1 = limit[1];
          if ((yych_1 != 'A') && (tok = limit + 1, yych_1 != 'a')) goto LAB_0064c941;
          yyaccept_1 = 0;
          yych_1 = limit[2];
          if ((yych_1 != 'I') && (tok = limit + 2, yych_1 != 'i')) goto LAB_0064c941;
          yyaccept_1 = 0;
          yych_1 = limit[3];
          if ((yych_1 != 'T') && (tok = limit + 3, yych_1 != 't')) goto LAB_0064c941;
          yyaccept_1 = 6;
          tok = limit + 4;
          yych_1 = limit[4];
          if (yych_1 < 0x3a) {
            if ((yych_1 == 0x21) || (0x22 < yych_1)) goto LAB_0064c941;
            goto LAB_0064d451;
          }
          if ((yych_1 < 0x3c) || (yych_1 == 0x7d)) goto LAB_0064d451;
          goto LAB_0064c941;
        }
        if (yych_1 < 0x6d) {
LAB_0064cbc3:
          yyaccept_1 = 0;
          tok = limit + 1;
          yych_1 = limit[1];
          if ((yych_1 != 'O') && (yych_1 != 'o')) goto LAB_0064c941;
          yyaccept_1 = 0;
          tok = limit + 2;
          yych_1 = limit[2];
          if ((yych_1 != 'O') && (yych_1 != 'o')) goto LAB_0064c941;
          yyaccept_1 = 0;
          tok = limit + 3;
          yych_1 = limit[3];
          if ((yych_1 != 'P') && (yych_1 != 'p')) goto LAB_0064c941;
          yyaccept_1 = 4;
          tok = limit + 4;
          yych_1 = limit[4];
          if (yych_1 < 0x3a) {
            if ((yych_1 == 0x21) || (0x22 < yych_1)) goto LAB_0064c941;
            goto LAB_0064d363;
          }
          if ((yych_1 < 0x3c) || (yych_1 == 0x7d)) goto LAB_0064d363;
          goto LAB_0064c941;
        }
        if (yych_1 != 0x73) goto LAB_0064c915;
      }
      yyaccept_1 = 0;
      yych_1 = limit[1];
      if ((yych_1 != 'T') && (tok = limit + 1, yych_1 != 't')) goto LAB_0064c941;
      yyaccept_1 = 0;
      yych_1 = limit[2];
      if ((yych_1 != 'O') && (tok = limit + 2, yych_1 != 'o')) goto LAB_0064c941;
      yyaccept_1 = 0;
      yych_1 = limit[3];
      if ((yych_1 != 'P') && (tok = limit + 3, yych_1 != 'p')) goto LAB_0064c941;
      yyaccept_1 = 5;
      tok = limit + 4;
      yych_1 = limit[4];
      if (yych_1 < 0x3a) {
        if ((yych_1 == 0x21) || (0x22 < yych_1)) goto LAB_0064c941;
        goto LAB_0064d3da;
      }
      if ((yych_1 < 0x3c) || (yych_1 == 0x7d)) goto LAB_0064d3da;
      goto LAB_0064c941;
    }
    if (yych_1 < 0x30) {
      if (yych_1 < 0x22) {
        if (yych_1 != 10) {
          if (0x20 < yych_1) goto LAB_0064c915;
          goto LAB_0064c8c6;
        }
        limit = limit + 1;
        goto LAB_006586e2;
      }
      if (yych_1 < 0x23) goto LAB_0064c9ad;
      if (0x23 < yych_1) {
        if (yych_1 < 0x2f) goto LAB_0064c915;
        pbVar5 = (byte *)(limit + 1);
        yych_1 = limit[1];
        if (0x2e < yych_1) {
          if (yych_1 < 0x3c) {
            if (yych_1 < 0x30) goto LAB_0064ce1e;
            if (yych_1 < 0x3a) goto LAB_0064c915;
          }
          else if (yych_1 != 0x7d) goto LAB_0064c915;
          goto LAB_0064cab4;
        }
        if (yych_1 < 0x23) {
          if (yych_1 == 0x21) goto LAB_0064c915;
          goto LAB_0064cab4;
        }
        if (yych_1 != 0x2a) goto LAB_0064c915;
        limit = limit + 2;
        goto LAB_00658608;
      }
      pcVar9 = limit + 1;
      yych_1 = limit[1];
      if (yych_1 == 'e') {
        yyaccept_1 = 0;
        tok = limit + 2;
        yych_1 = limit[2];
        if (yych_1 != 'n') goto LAB_0064c941;
        yyaccept_1 = 0;
        tok = limit + 3;
        yych_1 = limit[3];
        if (yych_1 != 'd') goto LAB_0064c941;
        pcVar9 = limit + 4;
        yych_1 = limit[4];
      }
      yyaccept_1 = 0;
      tok = pcVar9;
      if (yych_1 != 'r') goto LAB_0064c941;
      yyaccept_1 = 0;
      tok = pcVar9 + 1;
      yych_1 = pcVar9[1];
      if (yych_1 != 'e') goto LAB_0064c941;
      yyaccept_1 = 0;
      tok = pcVar9 + 2;
      yych_1 = pcVar9[2];
      if (yych_1 != 'g') goto LAB_0064c941;
      yyaccept_1 = 0;
      tok = pcVar9 + 3;
      yych_1 = pcVar9[3];
      if (yych_1 != 'i') goto LAB_0064c941;
      yyaccept_1 = 0;
      tok = pcVar9 + 4;
      yych_1 = pcVar9[4];
      if (yych_1 != 'o') goto LAB_0064c941;
      yyaccept_1 = 0;
      tok = pcVar9 + 5;
      yych_1 = pcVar9[5];
      limit = tok;
      if (yych_1 != 'n') goto LAB_0064c941;
      goto LAB_0064d4c2;
    }
    if (yych_1 < 0x46) {
      if (yych_1 < 0x3a) goto LAB_0064c915;
      if (yych_1 < 0x3b) {
        this->TokenType = 0x3a;
        pbVar5 = (byte *)(limit + 1);
      }
      else {
        if (0x3b < yych_1) goto LAB_0064c915;
        this->TokenType = 0x3b;
        pbVar5 = (byte *)(limit + 1);
      }
      goto LAB_0065871d;
    }
    if (yych_1 < 0x47) {
LAB_0064cb41:
      yyaccept_1 = 0;
      tok = limit + 1;
      yych_1 = limit[1];
      if ((yych_1 != 'A') && (yych_1 != 'a')) goto LAB_0064c941;
      yyaccept_1 = 0;
      tok = limit + 2;
      yych_1 = limit[2];
      if ((yych_1 != 'I') && (yych_1 != 'i')) goto LAB_0064c941;
      yyaccept_1 = 0;
      tok = limit + 3;
      yych_1 = limit[3];
      if ((yych_1 != 'L') && (yych_1 != 'l')) goto LAB_0064c941;
      yyaccept_1 = 2;
      tok = limit + 4;
      yych_1 = limit[4];
      if (yych_1 < 0x3a) {
        if ((yych_1 == 0x21) || (0x22 < yych_1)) goto LAB_0064c941;
        goto LAB_0064d267;
      }
      if ((yych_1 < 0x3c) || (yych_1 == 0x7d)) goto LAB_0064d267;
      goto LAB_0064c941;
    }
    if (0x47 < yych_1) {
      if (yych_1 < 0x4c) goto LAB_0064c915;
      goto LAB_0064cbc3;
    }
LAB_0064cb82:
    yyaccept_1 = 0;
    tok = limit + 1;
    yych_1 = limit[1];
    if ((yych_1 != 'O') && (yych_1 != 'o')) goto LAB_0064c941;
    yyaccept_1 = 0;
    tok = limit + 2;
    yych_1 = limit[2];
    if ((yych_1 != 'T') && (yych_1 != 't')) goto LAB_0064c941;
    yyaccept_1 = 0;
    tok = limit + 3;
    yych_1 = limit[3];
    if ((yych_1 != 'O') && (yych_1 != 'o')) goto LAB_0064c941;
    yyaccept_1 = 3;
    tok = limit + 4;
    yych_1 = limit[4];
    if (yych_1 < 0x3a) {
      if ((yych_1 == 0x21) || (0x22 < yych_1)) goto LAB_0064c941;
      goto LAB_0064d2de;
    }
    if ((yych_1 < 0x3c) || (yych_1 == 0x7d)) goto LAB_0064d2de;
    goto LAB_0064c941;
  }
  if ((marker._7_1_ & 1) == 0) {
    if ((this->CMode & 1U) == 0) {
      yyaccept_3 = 0;
      yych_3 = *limit;
      if (0x2e < yych_3) {
        if (0x3c < yych_3) {
          if (0x3d < yych_3) {
            if (yych_3 < 0x7b) goto LAB_00657469;
            if (0x7d < yych_3) goto LAB_00657469;
          }
          pbVar5 = (byte *)(limit + 1);
          goto LAB_0065871d;
        }
        if (0x2f < yych_3) {
          if (yych_3 != 0x3b) goto LAB_00657469;
          yych_3 = limit[1];
          limit = limit + 1;
          goto LAB_0065778f;
        }
        yyaccept_3 = 1;
        tok = limit + 1;
        yych_3 = limit[1];
        pbVar5 = (byte *)tok;
        if (0x2f < yych_3) {
          if (yych_3 < 0x3d) {
            limit = tok;
            if (yych_3 != 0x3b) goto LAB_00657469;
          }
          else if (0x3d < yych_3) {
            limit = tok;
            if (yych_3 < 0x7b) goto LAB_00657469;
            if (0x7d < yych_3) goto LAB_00657469;
          }
          goto LAB_0065871d;
        }
        if (yych_3 < 0x23) {
          limit = tok;
          if (yych_3 == 0x21) goto LAB_00657469;
          goto LAB_0065871d;
        }
        if (yych_3 != 0x2a) {
          limit = tok;
          if (yych_3 < 0x2f) goto LAB_00657469;
          do {
            yych_3 = limit[1];
            limit = limit + 1;
LAB_0065778f:
            tok = pcVar9 + 1;
            yyaccept_3 = 1;
          } while (yych_3 != '\n');
          limit = limit + 1;
          goto LAB_006586e2;
        }
        limit = limit + 2;
        goto LAB_00658608;
      }
      if (yych_3 < 0x21) {
        if (yych_3 != 10) goto LAB_0065741a;
        limit = limit + 1;
        goto LAB_006586e2;
      }
      if (yych_3 < 0x22) goto LAB_00657469;
      if (yych_3 < 0x23) {
LAB_0065899b:
        limit = limit + 1;
        if (_yyaccept == this->ScriptEndPtr) {
          this->ScriptPtr = limit;
          FString::operator=(&this->BigStringBuffer,"");
          this->StringLen = 0;
          goto LAB_006589f4;
        }
        this->ScriptPtr = this->ScriptEndPtr;
        cursor._7_1_ = false;
        goto LAB_00658c2b;
      }
      if (0x23 < yych_3) goto LAB_00657469;
      pcVar9 = limit + 1;
      yych_3 = limit[1];
      if (yych_3 == 'e') {
        tok = limit + 2;
        yych_3 = limit[2];
        if (yych_3 != 'n') goto LAB_00657495;
        tok = limit + 3;
        yych_3 = limit[3];
        if (yych_3 != 'd') goto LAB_00657495;
        pcVar9 = limit + 4;
        yych_3 = limit[4];
      }
      tok = pcVar9;
      if (yych_3 != 'r') goto LAB_00657495;
      tok = pcVar9 + 1;
      yych_3 = pcVar9[1];
      if (yych_3 != 'e') goto LAB_00657495;
      tok = pcVar9 + 2;
      yych_3 = pcVar9[2];
      if (yych_3 != 'g') goto LAB_00657495;
      tok = pcVar9 + 3;
      yych_3 = pcVar9[3];
      if (yych_3 != 'i') goto LAB_00657495;
      tok = pcVar9 + 4;
      yych_3 = pcVar9[4];
      if (yych_3 != 'o') goto LAB_00657495;
      tok = pcVar9 + 5;
      yych_3 = pcVar9[5];
      pbVar5 = (byte *)tok;
      if (yych_3 == 'n') goto LAB_006578ca;
      goto LAB_00657495;
    }
    local_68 = 0;
    yych_4 = *limit;
    if (0x39 < yych_4) {
      if (yych_4 < 0x5b) {
        if (yych_4 < 0x3d) {
          if (yych_4 < 0x3b) {
            yych_4 = limit[1];
            pbVar5 = (byte *)(limit + 1);
            if (yych_4 == ':') {
              pbVar5 = (byte *)(limit + 2);
            }
            goto LAB_0065871d;
          }
          if (0x3b < yych_4) {
            yych_4 = limit[1];
            pbVar5 = (byte *)(limit + 1);
            if (yych_4 == '<') {
              pbVar5 = (byte *)(limit + 2);
            }
            goto LAB_0065871d;
          }
        }
        else {
          if (yych_4 < 0x3e) {
            yych_4 = limit[1];
            pbVar5 = (byte *)(limit + 1);
            if (yych_4 == '=') {
              pbVar5 = (byte *)(limit + 2);
            }
            goto LAB_0065871d;
          }
          if (yych_4 < 0x3f) {
            yych_4 = limit[1];
            pbVar5 = (byte *)(limit + 1);
            if (yych_4 == '>') {
              pbVar5 = (byte *)(limit + 2);
            }
            goto LAB_0065871d;
          }
          pbVar5 = (byte *)limit;
          if (0x40 < yych_4) goto LAB_00657ce0;
        }
      }
      else if (yych_4 < 0x7b) {
        pbVar5 = (byte *)limit;
        if ((yych_4 == 0x5f) || (0x60 < yych_4)) goto LAB_00657ce0;
      }
      else {
        if (yych_4 == 0x7c) {
          yych_4 = limit[1];
          pbVar5 = (byte *)(limit + 1);
          if (yych_4 == '|') {
            pbVar5 = (byte *)(limit + 2);
          }
          goto LAB_0065871d;
        }
        pbVar5 = (byte *)limit;
        if (0x7e < yych_4) goto LAB_00657ce0;
      }
LAB_00657c5b:
      pbVar5 = (byte *)(limit + 1);
      goto LAB_0065871d;
    }
    if (yych_4 < 0x26) {
      if (yych_4 < 0x21) {
        if (yych_4 != 10) goto LAB_00657c0c;
        limit = limit + 1;
        goto LAB_006586e2;
      }
      if (yych_4 < 0x22) goto LAB_00657c5b;
      if (yych_4 < 0x23) goto LAB_0065899b;
      if (0x23 < yych_4) goto LAB_00657c5b;
      local_68 = 0;
      tok = limit + 1;
      yych_4 = limit[1];
      if (yych_4 == 'e') {
        yych_4 = limit[2];
        if ((yych_4 != 'n') || (yych_4 = limit[3], yych_4 != 'd')) goto LAB_00657fe5;
        yych_4 = limit[4];
        limit = limit + 4;
        if (yych_4 != 'r') goto LAB_00657fe5;
      }
      else {
        pbVar5 = (byte *)tok;
        limit = tok;
        if (yych_4 != 'r') goto LAB_0065871d;
      }
      yych_4 = limit[1];
      if (((yych_4 != 'e') || (yych_4 = limit[2], yych_4 != 'g')) ||
         ((yych_4 = limit[3], yych_4 != 'i' || (yych_4 = limit[4], yych_4 != 'o'))))
      goto LAB_00657fe5;
      yych_4 = limit[5];
      pcVar9 = limit + 5;
      if (yych_4 != 'n') goto LAB_00657fe5;
      do {
        limit = pcVar9;
        pcVar9 = limit + 1;
      } while (limit[1] != '\n');
      limit = limit + 2;
      yych_4 = '\n';
      goto LAB_006586e2;
    }
    if (yych_4 < 0x2d) {
      if (0x26 < yych_4) {
        pbVar5 = (byte *)limit;
        if (0x27 < yych_4) goto LAB_00657c5b;
        goto LAB_00657ce0;
      }
      yych_4 = limit[1];
      pbVar5 = (byte *)(limit + 1);
      if (yych_4 == '&') {
        pbVar5 = (byte *)(limit + 2);
      }
      goto LAB_0065871d;
    }
    if (yych_4 < 0x2e) goto LAB_00657d74;
    if (yych_4 < 0x2f) {
      pbVar5 = (byte *)(limit + 1);
      yych_4 = limit[1];
      if ((yych_4 < 0x30) || (0x39 < yych_4)) goto LAB_0065871d;
      goto LAB_0065803e;
    }
    if (0x2f < yych_4) goto LAB_00657dfc;
    local_68 = 0;
    tok = limit + 1;
    yych_4 = limit[1];
    if (yych_4 == '*') {
      limit = limit + 2;
LAB_00658608:
      if (*limit == '\n') {
        limit = limit + 1;
        if (_yyaccept <= limit) {
          this->ScriptPtr = this->ScriptEndPtr;
          cursor._7_1_ = false;
          goto LAB_00658c2b;
        }
        this->Line = this->Line + 1;
        this->Crossed = true;
        goto LAB_00658608;
      }
      if ((*limit != '*') || (limit[1] != '/')) {
        limit = limit + 1;
        goto LAB_00658608;
      }
      limit = limit + 2;
      if (_yyaccept <= limit) {
        this->ScriptPtr = this->ScriptEndPtr;
        cursor._7_1_ = false;
        goto LAB_00658c2b;
      }
      local_69 = 0x2f;
      goto LAB_0064c6e3;
    }
    pbVar5 = (byte *)tok;
    pcVar9 = tok;
    if (yych_4 != '/') goto LAB_0065871d;
    do {
      limit = pcVar9;
      pcVar9 = limit + 1;
    } while (limit[1] != '\n');
    limit = limit + 2;
    yych_4 = '\n';
  }
  else {
    yyaccept_2 = 0;
    yych_2 = *limit;
    switch(yych_2) {
    case '\t':
    case '\v':
    case '\f':
    case '\r':
    case ' ':
      goto LAB_0064d7c0;
    case '\n':
      limit = limit + 1;
      break;
    default:
      pcVar9 = limit + 1;
      goto LAB_0064d798;
    case '!':
      yych_2 = limit[1];
      if (yych_2 == '=') {
        this->TokenType = 0x120;
        pbVar5 = (byte *)(limit + 2);
      }
      else {
        this->TokenType = 0x21;
        pbVar5 = (byte *)(limit + 1);
      }
      goto LAB_0065871d;
    case '\"':
      yyaccept_2 = 0;
      tok = limit + 1;
      yych_2 = limit[1];
      limit = tok;
      while (puVar3 = (uchar *)limit, yych_2 != '\"') {
        while (limit = (char *)puVar3, yych_2 == '\\') {
          while( true ) {
            yych_2 = limit[1];
            puVar3 = (uchar *)(limit + 1);
            if (yych_2 != '\"') break;
            yyaccept_2 = 6;
            limit = limit + 2;
            tok = limit;
            if (*limit == '\"') {
              yych_2 = '\"';
              goto LAB_0064eb4a;
            }
            if (*limit != '\\') goto LAB_0064eb11;
          }
        }
LAB_0064eb11:
        limit = limit + 1;
        yych_2 = *limit;
      }
LAB_0064eb4a:
      limit = limit + 1;
      goto LAB_0064eb56;
    case '#':
      yyaccept_2 = 0;
      tok = limit + 1;
      yych_2 = limit[1];
      pcVar9 = tok;
      if (yych_2 < 0x66) {
        if (yych_2 == 0x49) goto LAB_0064eba8;
        if (yych_2 < 0x65) goto LAB_0064d798;
        yych_2 = limit[2];
        if ((yych_2 != 'n') || (yych_2 = limit[3], yych_2 != 'd')) goto LAB_0064ebdb;
        yych_2 = limit[4];
        limit = limit + 4;
        if (yych_2 != 'r') goto LAB_0064ebdb;
      }
      else {
        if (yych_2 < 0x6a) {
          if (yych_2 < 0x69) goto LAB_0064d798;
LAB_0064eba8:
          yych_2 = limit[2];
          if ((((((yych_2 != 'N') && (yych_2 != 'n')) ||
                ((yych_2 = limit[3], yych_2 != 'C' && (yych_2 != 'c')))) ||
               ((yych_2 = limit[4], yych_2 != 'L' && (yych_2 != 'l')))) ||
              ((yych_2 = limit[5], yych_2 != 'U' && (yych_2 != 'u')))) ||
             (((yych_2 = limit[6], yych_2 != 'D' && (yych_2 != 'd')) ||
              ((yych_2 = limit[7], yych_2 != 'E' && (yych_2 != 'e')))))) goto LAB_0064ebdb;
          this->TokenType = 0x177;
          pbVar5 = (byte *)(limit + 8);
          goto LAB_0065871d;
        }
        limit = tok;
        if (yych_2 != 0x72) goto LAB_0064d798;
      }
      yych_2 = limit[1];
      if ((((yych_2 != 'e') || (yych_2 = limit[2], yych_2 != 'g')) ||
          (yych_2 = limit[3], yych_2 != 'i')) || (yych_2 = limit[4], yych_2 != 'o'))
      goto LAB_0064ebdb;
      yych_2 = limit[5];
      pcVar9 = limit + 5;
      if (yych_2 != 'n') goto LAB_0064ebdb;
      do {
        limit = pcVar9;
        pcVar9 = limit + 1;
      } while (limit[1] != '\n');
      limit = limit + 2;
      yych_2 = '\n';
      break;
    case '%':
      yych_2 = limit[1];
      if (yych_2 == '=') {
        this->TokenType = 0x112;
        pbVar5 = (byte *)(limit + 2);
      }
      else {
        this->TokenType = 0x25;
        pbVar5 = (byte *)(limit + 1);
      }
      goto LAB_0065871d;
    case '&':
      yych_2 = limit[1];
      if (yych_2 == '&') {
        this->TokenType = 0x11b;
        pbVar5 = (byte *)(limit + 2);
      }
      else if (yych_2 == '=') {
        this->TokenType = 0x113;
        pbVar5 = (byte *)(limit + 2);
      }
      else {
        this->TokenType = 0x26;
        pbVar5 = (byte *)(limit + 1);
      }
      goto LAB_0065871d;
    case '\'':
      yyaccept_2 = 0;
      tok = limit + 1;
      yych_2 = limit[1];
      limit = tok;
      pcVar9 = tok;
      if (yych_2 != '\n') goto LAB_0064ecf5;
      goto LAB_0064d798;
    case '(':
      this->TokenType = 0x28;
      pbVar5 = (byte *)(limit + 1);
      goto LAB_0065871d;
    case ')':
      this->TokenType = 0x29;
      pbVar5 = (byte *)(limit + 1);
      goto LAB_0065871d;
    case '*':
      yych_2 = limit[1];
      if (yych_2 == '*') {
        this->TokenType = 0x123;
        pbVar5 = (byte *)(limit + 2);
      }
      else if (yych_2 == '=') {
        this->TokenType = 0x110;
        pbVar5 = (byte *)(limit + 2);
      }
      else {
        this->TokenType = 0x2a;
        pbVar5 = (byte *)(limit + 1);
      }
      goto LAB_0065871d;
    case '+':
      yych_2 = limit[1];
      if (yych_2 == '+') {
        this->TokenType = 0x119;
        pbVar5 = (byte *)(limit + 2);
      }
      else if (yych_2 == '=') {
        this->TokenType = 0x10e;
        pbVar5 = (byte *)(limit + 2);
      }
      else {
        this->TokenType = 0x2b;
        pbVar5 = (byte *)(limit + 1);
      }
      goto LAB_0065871d;
    case ',':
      this->TokenType = 0x2c;
      pbVar5 = (byte *)(limit + 1);
      goto LAB_0065871d;
    case '-':
      yych_2 = limit[1];
      if (yych_2 < 0x3d) {
        if (yych_2 == 0x2d) {
          this->TokenType = 0x11a;
          pbVar5 = (byte *)(limit + 2);
          goto LAB_0065871d;
        }
      }
      else {
        if (yych_2 < 0x3e) {
          this->TokenType = 0x10f;
          pbVar5 = (byte *)(limit + 2);
          goto LAB_0065871d;
        }
        if (yych_2 < 0x3f) {
          this->TokenType = 0x124;
          pbVar5 = (byte *)(limit + 2);
          goto LAB_0065871d;
        }
      }
      this->TokenType = 0x2d;
      pbVar5 = (byte *)(limit + 1);
      goto LAB_0065871d;
    case '.':
      pbVar5 = (byte *)(limit + 1);
      yych_2 = *pbVar5;
      if (yych_2 == 0x2e) {
        yych_2 = limit[2];
        if (yych_2 == '.') {
          this->TokenType = 0x10a;
          pbVar5 = (byte *)(limit + 3);
        }
        else {
          this->TokenType = 0x109;
          pbVar5 = (byte *)(limit + 2);
        }
      }
      else {
        if ((0x2f < yych_2) && (limit = (char *)pbVar5, yych_2 < 0x3a)) goto LAB_0064ee3b;
        this->TokenType = 0x2e;
      }
      goto LAB_0065871d;
    case '/':
      yyaccept_2 = 1;
      tok = limit + 1;
      yych_2 = limit[1];
      if (yych_2 < 0x2f) {
        if (yych_2 != 0x2a) goto LAB_0064db8d;
        limit = limit + 2;
        goto LAB_00658608;
      }
      pcVar9 = tok;
      if (yych_2 < 0x30) goto LAB_0064eefc;
      if (yych_2 != 0x3d) goto LAB_0064db8d;
      this->TokenType = 0x111;
      pbVar5 = (byte *)(limit + 2);
      goto LAB_0065871d;
    case '0':
      yyaccept_2 = 2;
      tok = limit + 1;
      yych_2 = limit[1];
      pbVar5 = (byte *)tok;
      if (yych_2 < 0x56) {
        if (0x44 < yych_2) {
          if (yych_2 < 0x4c) {
            if (yych_2 < 0x46) goto LAB_0064ef4c;
          }
          else {
            limit = tok;
            if ((yych_2 < 0x4d) || (0x54 < yych_2)) goto LAB_0064efac;
          }
          goto LAB_0064dcb7;
        }
        if (yych_2 < 0x2f) {
          limit = tok;
          if (0x2d < yych_2) goto LAB_0064ee3b;
          goto LAB_0064dcb7;
        }
        if ((yych_2 < 0x30) || (limit = tok, 0x39 < yych_2)) goto LAB_0064dcb7;
        goto LAB_0064dcca;
      }
      if (yych_2 < 0x6c) {
        if (0x58 < yych_2) {
          if (yych_2 == 0x65) goto LAB_0064ef4c;
          goto LAB_0064dcb7;
        }
        if (yych_2 < 0x58) goto LAB_0064dcb7;
      }
      else {
        if (yych_2 < 0x76) {
          limit = tok;
          if ((yych_2 < 0x6d) || (0x74 < yych_2)) goto LAB_0064efac;
          goto LAB_0064dcb7;
        }
        if (yych_2 != 0x78) goto LAB_0064dcb7;
      }
      pcVar9 = limit + 2;
      yych_2 = limit[2];
      limit = pcVar9;
      if (yych_2 < 0x41) {
        if ((yych_2 < 0x30) || (0x39 < yych_2)) goto LAB_0064ebdb;
        goto LAB_006507ab;
      }
      if ((yych_2 < 0x47) || ((0x60 < yych_2 && (yych_2 < 0x67)))) goto LAB_006507ab;
      goto LAB_0064ebdb;
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      goto LAB_0064dcca;
    case ':':
      yych_2 = limit[1];
      if (yych_2 == ':') {
        this->TokenType = 0x108;
        pbVar5 = (byte *)(limit + 2);
      }
      else {
        this->TokenType = 0x3a;
        pbVar5 = (byte *)(limit + 1);
      }
      goto LAB_0065871d;
    case ';':
      this->StateOptions = false;
      this->TokenType = 0x3b;
      pbVar5 = (byte *)(limit + 1);
      goto LAB_0065871d;
    case '<':
      yyaccept_2 = 3;
      tok = limit + 1;
      yych_2 = limit[1];
      if (yych_2 < 0x3c) goto LAB_0064de56;
      if (yych_2 < 0x3d) {
        yych_2 = limit[2];
        if (yych_2 == '=') {
          this->TokenType = 0x10d;
          pbVar5 = (byte *)(limit + 3);
        }
        else {
          this->TokenType = 0x118;
          pbVar5 = (byte *)(limit + 2);
        }
        goto LAB_0065871d;
      }
      if (yych_2 < 0x3e) {
        this->TokenType = 0x11d;
        pbVar5 = (byte *)(limit + 2);
        goto LAB_0065871d;
      }
      if (0x3e < yych_2) goto LAB_0064de56;
      yych_2 = limit[2];
      if (yych_2 != '=') goto LAB_0064ebdb;
      this->TokenType = 0x122;
      pbVar5 = (byte *)(limit + 3);
      goto LAB_0065871d;
    case '=':
      yych_2 = limit[1];
      if (yych_2 == '=') {
        this->TokenType = 0x11f;
        pbVar5 = (byte *)(limit + 2);
      }
      else {
        this->TokenType = 0x3d;
        pbVar5 = (byte *)(limit + 1);
      }
      goto LAB_0065871d;
    case '>':
      yych_2 = limit[1];
      if (0x3c < yych_2) {
        if (yych_2 < 0x3e) {
          this->TokenType = 0x11e;
          pbVar5 = (byte *)(limit + 2);
          goto LAB_0065871d;
        }
        if (yych_2 < 0x3f) {
          yych_2 = limit[2];
          if (0x3c < yych_2) {
            if (yych_2 < 0x3e) {
              this->TokenType = 0x10b;
              pbVar5 = (byte *)(limit + 3);
              goto LAB_0065871d;
            }
            if (yych_2 < 0x3f) {
              yych_2 = limit[3];
              if (yych_2 == '=') {
                this->TokenType = 0x10c;
                pbVar5 = (byte *)(limit + 4);
              }
              else {
                this->TokenType = 0x117;
                pbVar5 = (byte *)(limit + 3);
              }
              goto LAB_0065871d;
            }
          }
          this->TokenType = 0x116;
          pbVar5 = (byte *)(limit + 2);
          goto LAB_0065871d;
        }
      }
      this->TokenType = 0x3e;
      pbVar5 = (byte *)(limit + 1);
      goto LAB_0065871d;
    case '?':
      this->TokenType = 0x3f;
      pbVar5 = (byte *)(limit + 1);
      goto LAB_0065871d;
    case 'A':
    case 'a':
      pbVar5 = (byte *)(limit + 1);
      yych_2 = *pbVar5;
      if (yych_2 < 0x56) {
        if (0x4b < yych_2) {
          if (yych_2 < 0x52) {
            if (0x4c < yych_2) goto LAB_0064e32c;
            goto LAB_0064f21d;
          }
          if (0x52 < yych_2) {
            if (yych_2 < 0x55) goto LAB_0064e32c;
            goto LAB_0064f289;
          }
          goto LAB_0064f253;
        }
        if (yych_2 < 0x42) goto LAB_0064e32c;
        if (0x42 < yych_2) {
          if (0x43 < yych_2) goto LAB_0064e32c;
LAB_0064f1e7:
          yych_2 = limit[2];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 2), yych_2 != 't')) goto LAB_0064e32c;
          yych_2 = limit[3];
          if ((yych_2 != 'I') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'i')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'o')) goto LAB_0064e32c;
          yych_2 = limit[5];
          if ((yych_2 != 'N') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'n')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 6);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x125;
          goto LAB_0065871d;
        }
      }
      else {
        if (0x6c < yych_2) {
          if (yych_2 < 0x73) {
            if (yych_2 < 0x72) goto LAB_0064e32c;
LAB_0064f253:
            yych_2 = limit[2];
            if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'r')) goto LAB_0064e32c;
            yych_2 = limit[3];
            if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'a')) goto LAB_0064e32c;
            yych_2 = limit[4];
            if ((yych_2 != 'Y') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'y')) goto LAB_0064e32c;
            pbVar5 = (byte *)(limit + 5);
            yych_2 = *pbVar5;
            if (yych_2 < 0x5b) {
              if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
            }
            else if (yych_2 < 0x60) {
              if (0x5e < yych_2) goto LAB_0064e30b;
            }
            else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
            this->TokenType = 0x17d;
          }
          else {
            if (yych_2 != 0x75) goto LAB_0064e32c;
LAB_0064f289:
            yych_2 = limit[2];
            if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 2), yych_2 != 't')) goto LAB_0064e32c;
            yych_2 = limit[3];
            if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'o')) goto LAB_0064e32c;
            pbVar5 = (byte *)(limit + 4);
            yych_2 = *pbVar5;
            if (yych_2 < 0x5b) {
              if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
            }
            else if (yych_2 < 0x60) {
              if (0x5e < yych_2) goto LAB_0064e30b;
            }
            else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
            this->TokenType = 0x155;
          }
          goto LAB_0065871d;
        }
        if (0x62 < yych_2) {
          if (yych_2 < 100) goto LAB_0064f1e7;
          if (yych_2 < 0x6c) goto LAB_0064e32c;
LAB_0064f21d:
          yych_2 = limit[2];
          if ((yych_2 != 'I') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'i')) goto LAB_0064e32c;
          yych_2 = limit[3];
          if ((yych_2 != 'G') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'g')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'N') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'n')) goto LAB_0064e32c;
          yych_2 = limit[5];
          if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'o')) goto LAB_0064e32c;
          yych_2 = limit[6];
          if ((yych_2 != 'F') && (pbVar5 = (byte *)(limit + 6), yych_2 != 'f')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 7);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x180;
          goto LAB_0065871d;
        }
        if (yych_2 < 0x62) goto LAB_0064e32c;
      }
      yych_2 = limit[2];
      if ((yych_2 != 'S') && (pbVar5 = (byte *)(limit + 2), yych_2 != 's')) goto LAB_0064e32c;
      yych_2 = limit[3];
      if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 3), yych_2 != 't')) goto LAB_0064e32c;
      yych_2 = limit[4];
      if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'r')) goto LAB_0064e32c;
      yych_2 = limit[5];
      if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'a')) goto LAB_0064e32c;
      yych_2 = limit[6];
      if ((yych_2 != 'C') && (pbVar5 = (byte *)(limit + 6), yych_2 != 'c')) goto LAB_0064e32c;
      yych_2 = limit[7];
      if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 7), yych_2 != 't')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 8);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x14e;
      goto LAB_0065871d;
    case 'B':
    case 'b':
      pbVar5 = (byte *)(limit + 1);
      yych_2 = limit[1];
      if (yych_2 < 0x5a) {
        if (yych_2 < 0x52) {
          if (yych_2 != 0x4f) goto LAB_0064e32c;
LAB_0064f2bf:
          yych_2 = limit[2];
          if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'o')) goto LAB_0064e32c;
          yych_2 = limit[3];
          if ((yych_2 != 'L') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'l')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 4);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x133;
          goto LAB_0065871d;
        }
        if (0x52 < yych_2) {
          if (yych_2 < 0x59) goto LAB_0064e32c;
LAB_0064f363:
          yych_2 = limit[2];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 2), yych_2 != 't')) goto LAB_0064e32c;
          yych_2 = limit[3];
          if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'e')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 4);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x138;
          goto LAB_0065871d;
        }
      }
      else {
        if (yych_2 < 0x72) {
          if (yych_2 != 0x6f) goto LAB_0064e32c;
          goto LAB_0064f2bf;
        }
        if (0x72 < yych_2) {
          if (yych_2 != 0x79) goto LAB_0064e32c;
          goto LAB_0064f363;
        }
      }
      pbVar5 = (byte *)(limit + 2);
      yych_2 = limit[2];
      if (yych_2 < 0x4a) {
        if (yych_2 != 0x45) {
          if (yych_2 < 0x49) goto LAB_0064e32c;
LAB_00650a86:
          yych_2 = limit[3];
          if ((yych_2 != 'G') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'g')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'H') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'h')) goto LAB_0064e32c;
          yych_2 = limit[5];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 5), yych_2 != 't')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 6);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          iVar8 = 0x101;
          if ((this->StateOptions & 1U) != 0) {
            iVar8 = 0x18e;
          }
          this->TokenType = iVar8;
          goto LAB_0065871d;
        }
      }
      else {
        if (0x65 < yych_2) {
          if (yych_2 != 0x69) goto LAB_0064e32c;
          goto LAB_00650a86;
        }
        if (yych_2 < 0x65) goto LAB_0064e32c;
      }
      yych_2 = limit[3];
      if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'a')) goto LAB_0064e32c;
      yych_2 = limit[4];
      if ((yych_2 != 'K') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'k')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 5);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x126;
      goto LAB_0065871d;
    case 'C':
    case 'c':
      yych_2 = limit[1];
      switch(yych_2) {
      case 'A':
      case 'a':
        pbVar5 = (byte *)(limit + 2);
        yych_2 = limit[2];
        if (yych_2 < 0x54) {
          if (yych_2 != 0x4e) {
            if (yych_2 < 0x53) goto LAB_0064e32c;
LAB_00650b28:
            yych_2 = limit[3];
            if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'e')) goto LAB_0064e32c;
            pbVar5 = (byte *)(limit + 4);
            yych_2 = *pbVar5;
            if (yych_2 < 0x5b) {
              if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
            }
            else if (yych_2 < 0x60) {
              if (0x5e < yych_2) goto LAB_0064e30b;
            }
            else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
            this->TokenType = 0x127;
            goto LAB_0065871d;
          }
        }
        else {
          if (0x6e < yych_2) {
            if (yych_2 != 0x73) goto LAB_0064e32c;
            goto LAB_00650b28;
          }
          if (yych_2 < 0x6e) goto LAB_0064e32c;
        }
        yych_2 = limit[3];
        if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'r')) goto LAB_0064e32c;
        yych_2 = limit[4];
        if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'a')) goto LAB_0064e32c;
        yych_2 = limit[5];
        if ((yych_2 != 'I') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'i')) goto LAB_0064e32c;
        yych_2 = limit[6];
        if ((yych_2 != 'S') && (pbVar5 = (byte *)(limit + 6), yych_2 != 's')) goto LAB_0064e32c;
        yych_2 = limit[7];
        if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 7), yych_2 != 'e')) goto LAB_0064e32c;
        pbVar5 = (byte *)(limit + 8);
        yych_2 = *pbVar5;
        if (yych_2 < 0x5b) {
          if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
        }
        else if (yych_2 < 0x60) {
          if (0x5e < yych_2) goto LAB_0064e30b;
        }
        else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
        iVar8 = 0x101;
        if ((this->StateOptions & 1U) != 0) {
          iVar8 = 0x188;
        }
        this->TokenType = iVar8;
        goto LAB_0065871d;
      default:
        pbVar5 = (byte *)(limit + 1);
        goto LAB_0064e32c;
      case 'H':
      case 'h':
        yych_2 = limit[2];
        if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'a')) goto LAB_0064e32c;
        yych_2 = limit[3];
        if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'r')) goto LAB_0064e32c;
        pbVar5 = (byte *)(limit + 4);
        yych_2 = *pbVar5;
        if (yych_2 < 0x5b) {
          if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
        }
        else if (yych_2 < 0x60) {
          if (0x5e < yych_2) goto LAB_0064e30b;
        }
        else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
        this->TokenType = 0x137;
        goto LAB_0065871d;
      case 'L':
      case 'l':
        yych_2 = limit[2];
        if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'a')) goto LAB_0064e32c;
        yych_2 = limit[3];
        if ((yych_2 != 'S') && (pbVar5 = (byte *)(limit + 3), yych_2 != 's')) goto LAB_0064e32c;
        yych_2 = limit[4];
        if ((yych_2 != 'S') && (pbVar5 = (byte *)(limit + 4), yych_2 != 's')) goto LAB_0064e32c;
        pbVar5 = (byte *)(limit + 5);
        yych_2 = *pbVar5;
        if (yych_2 < 0x5b) {
          if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
        }
        else if (yych_2 < 0x60) {
          if (0x5e < yych_2) goto LAB_0064e30b;
        }
        else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
        this->TokenType = 0x146;
        goto LAB_0065871d;
      case 'O':
      case 'o':
        goto LAB_0064f473;
      case 'R':
      case 'r':
        yych_2 = limit[2];
        if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'o')) goto LAB_0064e32c;
        yych_2 = limit[3];
        if ((yych_2 != 'S') && (pbVar5 = (byte *)(limit + 3), yych_2 != 's')) goto LAB_0064e32c;
        yych_2 = limit[4];
        if ((yych_2 != 'S') && (pbVar5 = (byte *)(limit + 4), yych_2 != 's')) goto LAB_0064e32c;
        pbVar5 = (byte *)(limit + 5);
        yych_2 = *pbVar5;
        if (yych_2 < 0x5b) {
          if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
        }
        else if (yych_2 < 0x60) {
          if (0x5e < yych_2) goto LAB_0064e30b;
        }
        else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
        this->TokenType = 0x167;
        goto LAB_0065871d;
      }
    case 'D':
    case 'd':
      pbVar5 = (byte *)(limit + 1);
      yych_2 = limit[1];
      if (yych_2 < 0x50) {
        if (yych_2 != 0x45) {
          if (yych_2 < 0x4f) goto LAB_0064e32c;
LAB_0064f5af:
          pbVar5 = (byte *)(limit + 2);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if (0x40 < yych_2) {
              if (yych_2 < 0x54) goto LAB_0064e30b;
              if (yych_2 < 0x55) {
LAB_00650d70:
                pbVar5 = (byte *)(limit + 3);
                yych_2 = *pbVar5;
                if (yych_2 < 0x5b) {
                  if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
                }
                else if (yych_2 < 0x60) {
                  if (0x5e < yych_2) goto LAB_0064e30b;
                }
                else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
                this->TokenType = 0x166;
                goto LAB_0065871d;
              }
              if (0x55 < yych_2) goto LAB_0064e30b;
LAB_00650e01:
              yych_2 = limit[3];
              if ((yych_2 != 'B') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'b'))
              goto LAB_0064e32c;
              yych_2 = limit[4];
              if ((yych_2 != 'L') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'l'))
              goto LAB_0064e32c;
              yych_2 = limit[5];
              if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'e'))
              goto LAB_0064e32c;
              pbVar5 = (byte *)(limit + 6);
              yych_2 = *pbVar5;
              if (yych_2 < 0x5b) {
                if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
              }
              else if (yych_2 < 0x60) {
                if (0x5e < yych_2) goto LAB_0064e30b;
              }
              else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
              this->TokenType = 0x136;
              goto LAB_0065871d;
            }
            if ((0x2f < yych_2) && (yych_2 < 0x3a)) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x74) {
            if ((yych_2 == 0x5f) || (0x60 < yych_2)) goto LAB_0064e30b;
          }
          else {
            if (yych_2 < 0x75) goto LAB_00650d70;
            if (yych_2 < 0x76) goto LAB_00650e01;
            if (yych_2 < 0x7b) goto LAB_0064e30b;
          }
          this->TokenType = 299;
          goto LAB_0065871d;
        }
      }
      else {
        if (0x65 < yych_2) {
          if (yych_2 != 0x6f) goto LAB_0064e32c;
          goto LAB_0064f5af;
        }
        if (yych_2 < 0x65) goto LAB_0064e32c;
      }
      pbVar5 = (byte *)(limit + 2);
      yych_2 = limit[2];
      if (yych_2 < 0x51) {
        if (yych_2 != 0x46) {
          if (yych_2 < 0x50) goto LAB_0064e32c;
LAB_00650d3a:
          yych_2 = limit[3];
          if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'r')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'e')) goto LAB_0064e32c;
          yych_2 = limit[5];
          if ((yych_2 != 'C') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'c')) goto LAB_0064e32c;
          yych_2 = limit[6];
          if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 6), yych_2 != 'a')) goto LAB_0064e32c;
          yych_2 = limit[7];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 7), yych_2 != 't')) goto LAB_0064e32c;
          yych_2 = limit[8];
          if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 8), yych_2 != 'e')) goto LAB_0064e32c;
          yych_2 = limit[9];
          if ((yych_2 != 'D') && (pbVar5 = (byte *)(limit + 9), yych_2 != 'd')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 10);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x186;
          goto LAB_0065871d;
        }
      }
      else {
        if (0x66 < yych_2) {
          if (yych_2 != 0x70) goto LAB_0064e32c;
          goto LAB_00650d3a;
        }
        if (yych_2 < 0x66) goto LAB_0064e32c;
      }
      yych_2 = limit[3];
      if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'a')) goto LAB_0064e32c;
      yych_2 = limit[4];
      if ((yych_2 != 'U') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'u')) goto LAB_0064e32c;
      yych_2 = limit[5];
      if ((yych_2 != 'L') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'l')) goto LAB_0064e32c;
      yych_2 = limit[6];
      if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 6), yych_2 != 't')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 7);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if (0x40 < yych_2) {
          if (yych_2 != 0x50) goto LAB_0064e30b;
LAB_00656930:
          yych_2 = limit[8];
          if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 8), yych_2 != 'r')) goto LAB_0064e32c;
          yych_2 = limit[9];
          if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 9), yych_2 != 'o')) goto LAB_0064e32c;
          yych_2 = limit[10];
          if ((yych_2 != 'P') && (pbVar5 = (byte *)(limit + 10), yych_2 != 'p')) goto LAB_0064e32c;
          yych_2 = limit[0xb];
          if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 0xb), yych_2 != 'e')) goto LAB_0064e32c;
          yych_2 = limit[0xc];
          if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 0xc), yych_2 != 'r')) goto LAB_0064e32c;
          yych_2 = limit[0xd];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 0xd), yych_2 != 't')) goto LAB_0064e32c;
          yych_2 = limit[0xe];
          if ((yych_2 != 'I') && (pbVar5 = (byte *)(limit + 0xe), yych_2 != 'i')) goto LAB_0064e32c;
          yych_2 = limit[0xf];
          if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 0xf), yych_2 != 'e')) goto LAB_0064e32c;
          yych_2 = limit[0x10];
          if ((yych_2 != 'S') && (pbVar5 = (byte *)(limit + 0x10), yych_2 != 's'))
          goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 0x11);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x157;
          goto LAB_0065871d;
        }
        if ((0x2f < yych_2) && (yych_2 < 0x3a)) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x61) {
        if (yych_2 == 0x5f) goto LAB_0064e30b;
      }
      else {
        if (yych_2 == 0x70) goto LAB_00656930;
        if (yych_2 < 0x7b) goto LAB_0064e30b;
      }
      this->TokenType = 0x12a;
      goto LAB_0065871d;
    case 'E':
    case 'e':
      yych_2 = limit[1];
      switch(yych_2) {
      case 'L':
      case 'l':
        yych_2 = limit[2];
        if ((yych_2 != 'S') && (pbVar5 = (byte *)(limit + 2), yych_2 != 's')) goto LAB_0064e32c;
        yych_2 = limit[3];
        if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'e')) goto LAB_0064e32c;
        pbVar5 = (byte *)(limit + 4);
        yych_2 = *pbVar5;
        if (yych_2 < 0x5b) {
          if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
        }
        else if (yych_2 < 0x60) {
          if (0x5e < yych_2) goto LAB_0064e30b;
        }
        else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
        this->TokenType = 300;
        goto LAB_0065871d;
      default:
        pbVar5 = (byte *)(limit + 1);
        goto LAB_0064e32c;
      case 'N':
      case 'n':
        yych_2 = limit[2];
        if ((yych_2 != 'U') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'u')) goto LAB_0064e32c;
        yych_2 = limit[3];
        if ((yych_2 != 'M') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'm')) goto LAB_0064e32c;
        pbVar5 = (byte *)(limit + 4);
        yych_2 = *pbVar5;
        if (yych_2 < 0x5b) {
          if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
        }
        else if (yych_2 < 0x60) {
          if (0x5e < yych_2) goto LAB_0064e30b;
        }
        else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
        this->TokenType = 0x147;
        goto LAB_0065871d;
      case 'V':
      case 'v':
        yych_2 = limit[2];
        if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'e')) goto LAB_0064e32c;
        yych_2 = limit[3];
        if ((yych_2 != 'N') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'n')) goto LAB_0064e32c;
        yych_2 = limit[4];
        if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 4), yych_2 != 't')) goto LAB_0064e32c;
        pbVar5 = (byte *)(limit + 5);
        yych_2 = *pbVar5;
        if (yych_2 < 0x5b) {
          if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
        }
        else if (yych_2 < 0x60) {
          if (0x5e < yych_2) goto LAB_0064e30b;
        }
        else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
        this->TokenType = 0x15c;
        goto LAB_0065871d;
      case 'X':
      case 'x':
        goto LAB_0064f730;
      }
    case 'F':
    case 'f':
      pbVar5 = (byte *)(limit + 1);
      yych_2 = limit[1];
      if (yych_2 < 0x50) {
        if (yych_2 < 0x4a) {
          if (yych_2 != 0x41) {
            if (yych_2 < 0x49) goto LAB_0064e32c;
            goto LAB_0064f836;
          }
          goto LAB_0064f7c8;
        }
        if (yych_2 == 0x4c) goto LAB_0064f86c;
        if (yych_2 < 0x4f) goto LAB_0064e32c;
      }
      else {
        if (yych_2 < 0x6a) {
          if (yych_2 == 0x61) {
LAB_0064f7c8:
            pbVar5 = (byte *)(limit + 2);
            yych_2 = limit[2];
            if (yych_2 < 0x54) {
              if (yych_2 != 0x4c) {
                if (yych_2 < 0x53) goto LAB_0064e32c;
LAB_00650fb1:
                yych_2 = limit[3];
                if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 3), yych_2 != 't'))
                goto LAB_0064e32c;
                pbVar5 = (byte *)(limit + 4);
                yych_2 = *pbVar5;
                if (yych_2 < 0x5b) {
                  if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
                }
                else if (yych_2 < 0x60) {
                  if (0x5e < yych_2) goto LAB_0064e30b;
                }
                else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
                iVar8 = 0x101;
                if ((this->StateOptions & 1U) != 0) {
                  iVar8 = 0x189;
                }
                this->TokenType = iVar8;
                goto LAB_0065871d;
              }
            }
            else {
              if (0x6c < yych_2) {
                if (yych_2 != 0x73) goto LAB_0064e32c;
                goto LAB_00650fb1;
              }
              if (yych_2 < 0x6c) goto LAB_0064e32c;
            }
            yych_2 = limit[3];
            if ((yych_2 != 'S') && (pbVar5 = (byte *)(limit + 3), yych_2 != 's')) goto LAB_0064e32c;
            yych_2 = limit[4];
            if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'e')) goto LAB_0064e32c;
            pbVar5 = (byte *)(limit + 5);
            yych_2 = *pbVar5;
            if (yych_2 < 0x5b) {
              if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
            }
            else if (yych_2 < 0x60) {
              if (0x5e < yych_2) goto LAB_0064e30b;
            }
            else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
            this->TokenType = 0x151;
            goto LAB_0065871d;
          }
          if (yych_2 < 0x69) goto LAB_0064e32c;
LAB_0064f836:
          yych_2 = limit[2];
          if ((yych_2 != 'N') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'n')) goto LAB_0064e32c;
          yych_2 = limit[3];
          if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'a')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'L') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'l')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 5);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x160;
          goto LAB_0065871d;
        }
        if (yych_2 < 0x6d) {
          if (yych_2 < 0x6c) goto LAB_0064e32c;
LAB_0064f86c:
          yych_2 = limit[2];
          if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'o')) goto LAB_0064e32c;
          yych_2 = limit[3];
          if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'a')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 4), yych_2 != 't')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 5);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x134;
          goto LAB_0065871d;
        }
        if (yych_2 != 0x6f) goto LAB_0064e32c;
      }
      yych_2 = limit[2];
      if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'r')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 3);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if (0x40 < yych_2) {
          if (yych_2 != 0x45) goto LAB_0064e30b;
LAB_0065298b:
          yych_2 = limit[4];
          if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'a')) goto LAB_0064e32c;
          yych_2 = limit[5];
          if ((yych_2 != 'C') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'c')) goto LAB_0064e32c;
          yych_2 = limit[6];
          if ((yych_2 != 'H') && (pbVar5 = (byte *)(limit + 6), yych_2 != 'h')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 7);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x14f;
          goto LAB_0065871d;
        }
        if ((0x2f < yych_2) && (yych_2 < 0x3a)) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x61) {
        if (yych_2 == 0x5f) goto LAB_0064e30b;
      }
      else {
        if (yych_2 == 0x65) goto LAB_0065298b;
        if (yych_2 < 0x7b) goto LAB_0064e30b;
      }
      this->TokenType = 0x12d;
      goto LAB_0065871d;
    case 'G':
    case 'g':
      pbVar5 = (byte *)(limit + 1);
      yych_2 = limit[1];
      if (yych_2 < 0x50) {
        if (yych_2 != 0x4c) {
          if (yych_2 < 0x4f) goto LAB_0064e32c;
LAB_0064f90e:
          yych_2 = limit[2];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 2), yych_2 != 't')) goto LAB_0064e32c;
          yych_2 = limit[3];
          if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'o')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 4);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x14d;
          goto LAB_0065871d;
        }
      }
      else {
        if (0x6c < yych_2) {
          if (yych_2 != 0x6f) goto LAB_0064e32c;
          goto LAB_0064f90e;
        }
        if (yych_2 < 0x6c) goto LAB_0064e32c;
      }
      yych_2 = limit[2];
      if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'o')) goto LAB_0064e32c;
      yych_2 = limit[3];
      if ((yych_2 != 'B') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'b')) goto LAB_0064e32c;
      yych_2 = limit[4];
      if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'a')) goto LAB_0064e32c;
      yych_2 = limit[5];
      if ((yych_2 != 'L') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'l')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 6);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x175;
      goto LAB_0065871d;
    case 'H':
    case 'J':
    case 'K':
    case 'Q':
    case 'X':
    case 'Y':
    case 'Z':
    case '_':
    case 'h':
    case 'j':
    case 'k':
    case 'q':
    case 'x':
    case 'y':
    case 'z':
      pbVar5 = (byte *)limit;
      goto LAB_0064e30b;
    case 'I':
    case 'i':
      pbVar5 = (byte *)(limit + 1);
      yych_2 = limit[1];
      if (yych_2 < 0x54) {
        if (yych_2 < 0x4e) {
          if (yych_2 != 0x46) goto LAB_0064e32c;
LAB_0064f944:
          pbVar5 = (byte *)(limit + 2);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x12e;
          goto LAB_0065871d;
        }
        if (0x4e < yych_2) {
          if (yych_2 < 0x53) goto LAB_0064e32c;
LAB_0064fab4:
          pbVar5 = (byte *)(limit + 2);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x178;
          goto LAB_0065871d;
        }
      }
      else {
        if (yych_2 < 0x6e) {
          if (yych_2 != 0x66) goto LAB_0064e32c;
          goto LAB_0064f944;
        }
        if (0x6e < yych_2) {
          if (yych_2 != 0x73) goto LAB_0064e32c;
          goto LAB_0064fab4;
        }
      }
      pbVar5 = (byte *)(limit + 2);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if (0x40 < yych_2) {
          if (yych_2 < 0x53) goto LAB_0064e30b;
          if (0x53 < yych_2) {
            if (0x54 < yych_2) goto LAB_0064e30b;
LAB_00651199:
            pbVar5 = (byte *)(limit + 3);
            yych_2 = *pbVar5;
            if (yych_2 < 0x3a) {
              if (0x31 < yych_2) {
                if (yych_2 != 0x38) goto LAB_0064e30b;
                pbVar5 = (byte *)(limit + 4);
                yych_2 = *pbVar5;
                if (yych_2 < 0x5b) {
                  if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
                }
                else if (yych_2 < 0x60) {
                  if (0x5e < yych_2) goto LAB_0064e30b;
                }
                else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
                this->TokenType = 0x13c;
                goto LAB_0065871d;
              }
              if (0x2f < yych_2) {
                if (yych_2 < 0x31) goto LAB_0064e30b;
                yych_2 = limit[4];
                pbVar5 = (byte *)(limit + 4);
                if (yych_2 != '6') goto LAB_0064e32c;
                pbVar5 = (byte *)(limit + 5);
                yych_2 = *pbVar5;
                if (yych_2 < 0x5b) {
                  if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
                }
                else if (yych_2 < 0x60) {
                  if (0x5e < yych_2) goto LAB_0064e30b;
                }
                else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
                this->TokenType = 0x13e;
                goto LAB_0065871d;
              }
            }
            else if (yych_2 < 0x5f) {
              if ((0x40 < yych_2) && (yych_2 < 0x5b)) goto LAB_0064e30b;
            }
            else if ((yych_2 != 0x60) && (yych_2 < 0x7b)) goto LAB_0064e30b;
            this->TokenType = 0x140;
            goto LAB_0065871d;
          }
LAB_00651163:
          yych_2 = limit[3];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 3), yych_2 != 't')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'a')) goto LAB_0064e32c;
          yych_2 = limit[5];
          if ((yych_2 != 'N') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'n')) goto LAB_0064e32c;
          yych_2 = limit[6];
          if ((yych_2 != 'C') && (pbVar5 = (byte *)(limit + 6), yych_2 != 'c')) goto LAB_0064e32c;
          yych_2 = limit[7];
          if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 7), yych_2 != 'e')) goto LAB_0064e32c;
          yych_2 = limit[8];
          if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 8), yych_2 != 'o')) goto LAB_0064e32c;
          yych_2 = limit[9];
          if ((yych_2 != 'F') && (pbVar5 = (byte *)(limit + 9), yych_2 != 'f')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 10);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x154;
          goto LAB_0065871d;
        }
        if ((0x2f < yych_2) && (yych_2 < 0x3a)) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x73) {
        if ((yych_2 == 0x5f) || (0x60 < yych_2)) goto LAB_0064e30b;
      }
      else {
        if (yych_2 < 0x74) goto LAB_00651163;
        if (yych_2 < 0x75) goto LAB_00651199;
        if (yych_2 < 0x7b) goto LAB_0064e30b;
      }
      this->TokenType = 0x17e;
      goto LAB_0065871d;
    case 'L':
    case 'l':
      pbVar5 = (byte *)(limit + 1);
      yych_2 = limit[1];
      if (yych_2 < 0x50) {
        if (yych_2 < 0x46) {
          if (yych_2 != 0x41) {
            if (yych_2 < 0x45) goto LAB_0064e32c;
            goto LAB_0064fb7b;
          }
          goto LAB_0064fb45;
        }
        if (yych_2 == 0x49) goto LAB_0064fbb1;
        if (yych_2 < 0x4f) goto LAB_0064e32c;
      }
      else {
        if (yych_2 < 0x66) {
          if (yych_2 != 0x61) {
            if (yych_2 < 0x65) goto LAB_0064e32c;
LAB_0064fb7b:
            yych_2 = limit[2];
            if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 2), yych_2 != 't')) goto LAB_0064e32c;
            pbVar5 = (byte *)(limit + 3);
            yych_2 = *pbVar5;
            if (yych_2 < 0x5b) {
              if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
            }
            else if (yych_2 < 0x60) {
              if (0x5e < yych_2) goto LAB_0064e30b;
            }
            else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
            this->TokenType = 399;
            goto LAB_0065871d;
          }
LAB_0064fb45:
          yych_2 = limit[2];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 2), yych_2 != 't')) goto LAB_0064e32c;
          yych_2 = limit[3];
          if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'e')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'N') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'n')) goto LAB_0064e32c;
          yych_2 = limit[5];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 5), yych_2 != 't')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 6);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x16a;
          goto LAB_0065871d;
        }
        if (yych_2 < 0x6a) {
          if (yych_2 < 0x69) goto LAB_0064e32c;
LAB_0064fbb1:
          yych_2 = limit[2];
          if ((yych_2 != 'G') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'g')) goto LAB_0064e32c;
          yych_2 = limit[3];
          if ((yych_2 != 'H') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'h')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 4), yych_2 != 't')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 5);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          iVar8 = 0x101;
          if ((this->StateOptions & 1U) != 0) {
            iVar8 = 0x18a;
          }
          this->TokenType = iVar8;
          goto LAB_0065871d;
        }
        if (yych_2 != 0x6f) goto LAB_0064e32c;
      }
      pbVar5 = (byte *)(limit + 2);
      yych_2 = limit[2];
      if (yych_2 < 0x4f) {
        if (yych_2 != 0x43) {
          if (yych_2 < 0x4e) goto LAB_0064e32c;
LAB_00651379:
          yych_2 = limit[3];
          if ((yych_2 != 'G') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'g')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 4);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x142;
          goto LAB_0065871d;
        }
      }
      else {
        if (99 < yych_2) {
          if (yych_2 != 0x6e) goto LAB_0064e32c;
          goto LAB_00651379;
        }
        if (yych_2 < 99) goto LAB_0064e32c;
      }
      yych_2 = limit[3];
      if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'a')) goto LAB_0064e32c;
      yych_2 = limit[4];
      if ((yych_2 != 'L') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'l')) goto LAB_0064e32c;
      yych_2 = limit[5];
      if ((yych_2 != 'I') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'i')) goto LAB_0064e32c;
      yych_2 = limit[6];
      if ((yych_2 != 'Z') && (pbVar5 = (byte *)(limit + 6), yych_2 != 'z')) goto LAB_0064e32c;
      yych_2 = limit[7];
      if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 7), yych_2 != 'e')) goto LAB_0064e32c;
      yych_2 = limit[8];
      if ((yych_2 != 'D') && (pbVar5 = (byte *)(limit + 8), yych_2 != 'd')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 9);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x169;
      goto LAB_0065871d;
    case 'M':
    case 'm':
      pbVar5 = (byte *)(limit + 1);
      yych_2 = limit[1];
      if (yych_2 < 0x46) {
        if (yych_2 != 0x41) {
          if (yych_2 < 0x45) goto LAB_0064e32c;
LAB_0064fc8b:
          yych_2 = limit[2];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 2), yych_2 != 't')) goto LAB_0064e32c;
          yych_2 = limit[3];
          if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'a')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 4);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x185;
          goto LAB_0065871d;
        }
      }
      else {
        if (0x61 < yych_2) {
          if (yych_2 != 0x65) goto LAB_0064e32c;
          goto LAB_0064fc8b;
        }
        if (yych_2 < 0x61) goto LAB_0064e32c;
      }
      yych_2 = limit[2];
      if ((yych_2 != 'P') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'p')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 3);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x17c;
      goto LAB_0065871d;
    case 'N':
    case 'n':
      pbVar5 = (byte *)(limit + 1);
      yych_2 = limit[1];
      if (yych_2 < 0x56) {
        if (yych_2 < 0x46) {
          if (yych_2 != 0x41) {
            if (yych_2 < 0x45) goto LAB_0064e32c;
LAB_0064fd2f:
            yych_2 = limit[2];
            if ((yych_2 != 'W') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'w')) goto LAB_0064e32c;
            pbVar5 = (byte *)(limit + 3);
            yych_2 = *pbVar5;
            if (yych_2 < 0x5b) {
              if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
            }
            else if (yych_2 < 0x60) {
              if (0x5e < yych_2) goto LAB_0064e30b;
            }
            else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
            this->TokenType = 0x153;
            goto LAB_0065871d;
          }
LAB_0064fcc1:
          pbVar5 = (byte *)(limit + 2);
          yych_2 = limit[2];
          if (yych_2 < 0x55) {
            if (yych_2 != 0x4d) {
              if (yych_2 < 0x54) goto LAB_0064e32c;
LAB_006514ac:
              yych_2 = limit[3];
              if ((yych_2 != 'I') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'i'))
              goto LAB_0064e32c;
              yych_2 = limit[4];
              if ((yych_2 != 'V') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'v'))
              goto LAB_0064e32c;
              yych_2 = limit[5];
              if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'e'))
              goto LAB_0064e32c;
              pbVar5 = (byte *)(limit + 6);
              yych_2 = *pbVar5;
              if (yych_2 < 0x5b) {
                if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
              }
              else if (yych_2 < 0x60) {
                if (0x5e < yych_2) goto LAB_0064e30b;
              }
              else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
              this->TokenType = 0x158;
              goto LAB_0065871d;
            }
          }
          else {
            if (0x6d < yych_2) {
              if (yych_2 != 0x74) goto LAB_0064e32c;
              goto LAB_006514ac;
            }
            if (yych_2 < 0x6d) goto LAB_0064e32c;
          }
          yych_2 = limit[3];
          if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'e')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 4);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x148;
          goto LAB_0065871d;
        }
        if (yych_2 != 0x4f) {
          if (yych_2 < 0x55) goto LAB_0064e32c;
LAB_0064fdd3:
          yych_2 = limit[2];
          if ((yych_2 != 'L') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'l')) goto LAB_0064e32c;
          yych_2 = limit[3];
          if ((yych_2 != 'L') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'l')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 4);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x174;
          goto LAB_0065871d;
        }
      }
      else {
        if (yych_2 < 0x66) {
          if (yych_2 != 0x61) {
            if (yych_2 < 0x65) goto LAB_0064e32c;
            goto LAB_0064fd2f;
          }
          goto LAB_0064fcc1;
        }
        if (0x6f < yych_2) {
          if (yych_2 != 0x75) goto LAB_0064e32c;
          goto LAB_0064fdd3;
        }
        if (yych_2 < 0x6f) goto LAB_0064e32c;
      }
      pbVar5 = (byte *)(limit + 2);
      yych_2 = limit[2];
      if (yych_2 < 0x4f) {
        if (yych_2 != 0x44) {
          if (yych_2 < 0x4e) goto LAB_0064e32c;
LAB_006515a9:
          yych_2 = limit[3];
          if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'e')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 4);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x152;
          goto LAB_0065871d;
        }
      }
      else {
        if (100 < yych_2) {
          if (yych_2 != 0x6e) goto LAB_0064e32c;
          goto LAB_006515a9;
        }
        if (yych_2 < 100) goto LAB_0064e32c;
      }
      yych_2 = limit[3];
      if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'e')) goto LAB_0064e32c;
      yych_2 = limit[4];
      if ((yych_2 != 'L') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'l')) goto LAB_0064e32c;
      yych_2 = limit[5];
      if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'a')) goto LAB_0064e32c;
      yych_2 = limit[6];
      if ((yych_2 != 'Y') && (pbVar5 = (byte *)(limit + 6), yych_2 != 'y')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 7);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      iVar8 = 0x101;
      if ((this->StateOptions & 1U) != 0) {
        iVar8 = 0x18b;
      }
      this->TokenType = iVar8;
      goto LAB_0065871d;
    case 'O':
    case 'o':
      pbVar5 = (byte *)(limit + 1);
      yych_2 = limit[1];
      if (yych_2 < 0x57) {
        if (yych_2 < 0x50) {
          if (yych_2 != 0x46) goto LAB_0064e32c;
LAB_0064fe09:
          yych_2 = limit[2];
          if ((yych_2 != 'F') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'f')) goto LAB_0064e32c;
          yych_2 = limit[3];
          if ((yych_2 != 'S') && (pbVar5 = (byte *)(limit + 3), yych_2 != 's')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'e')) goto LAB_0064e32c;
          yych_2 = limit[5];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 5), yych_2 != 't')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 6);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          iVar8 = 0x101;
          if ((this->StateOptions & 1U) != 0) {
            iVar8 = 0x18c;
          }
          this->TokenType = iVar8;
          goto LAB_0065871d;
        }
        if (yych_2 < 0x51) {
LAB_0064fe3f:
          yych_2 = limit[2];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 2), yych_2 != 't')) goto LAB_0064e32c;
          yych_2 = limit[3];
          if ((yych_2 != 'I') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'i')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'o')) goto LAB_0064e32c;
          yych_2 = limit[5];
          if ((yych_2 != 'N') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'n')) goto LAB_0064e32c;
          yych_2 = limit[6];
          if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 6), yych_2 != 'a')) goto LAB_0064e32c;
          yych_2 = limit[7];
          if ((yych_2 != 'L') && (pbVar5 = (byte *)(limit + 7), yych_2 != 'l')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 8);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x16f;
          goto LAB_0065871d;
        }
        if (yych_2 < 0x55) goto LAB_0064e32c;
        if (0x55 < yych_2) goto LAB_0064feab;
      }
      else {
        if (yych_2 < 0x71) {
          if (yych_2 != 0x66) {
            if (yych_2 < 0x70) goto LAB_0064e32c;
            goto LAB_0064fe3f;
          }
          goto LAB_0064fe09;
        }
        if (yych_2 < 0x75) goto LAB_0064e32c;
        if (0x75 < yych_2) {
          if (0x76 < yych_2) goto LAB_0064e32c;
LAB_0064feab:
          yych_2 = limit[2];
          if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'e')) goto LAB_0064e32c;
          yych_2 = limit[3];
          if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'r')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'r')) goto LAB_0064e32c;
          yych_2 = limit[5];
          if ((yych_2 != 'I') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'i')) goto LAB_0064e32c;
          yych_2 = limit[6];
          if ((yych_2 != 'D') && (pbVar5 = (byte *)(limit + 6), yych_2 != 'd')) goto LAB_0064e32c;
          yych_2 = limit[7];
          if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 7), yych_2 != 'e')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 8);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x172;
          goto LAB_0065871d;
        }
      }
      yych_2 = limit[2];
      if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 2), yych_2 != 't')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 3);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x15a;
      goto LAB_0065871d;
    case 'P':
    case 'p':
      pbVar5 = (byte *)(limit + 1);
      yych_2 = limit[1];
      if (yych_2 < 0x56) {
        if (yych_2 != 0x52) {
          if (yych_2 < 0x55) goto LAB_0064e32c;
LAB_0064ff4f:
          yych_2 = limit[2];
          if ((yych_2 != 'B') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'b')) goto LAB_0064e32c;
          yych_2 = limit[3];
          if ((yych_2 != 'L') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'l')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'I') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'i')) goto LAB_0064e32c;
          yych_2 = limit[5];
          if ((yych_2 != 'C') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'c')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 6);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x163;
          goto LAB_0065871d;
        }
      }
      else {
        if (0x72 < yych_2) {
          if (yych_2 != 0x75) goto LAB_0064e32c;
          goto LAB_0064ff4f;
        }
        if (yych_2 < 0x72) goto LAB_0064e32c;
      }
      pbVar5 = (byte *)(limit + 2);
      yych_2 = limit[2];
      if (yych_2 < 0x50) {
        if (yych_2 != 0x49) {
          if (yych_2 < 0x4f) goto LAB_0064e32c;
LAB_0065177e:
          yych_2 = limit[3];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 3), yych_2 != 't')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'e')) goto LAB_0064e32c;
          yych_2 = limit[5];
          if ((yych_2 != 'C') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'c')) goto LAB_0064e32c;
          yych_2 = limit[6];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 6), yych_2 != 't')) goto LAB_0064e32c;
          yych_2 = limit[7];
          if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 7), yych_2 != 'e')) goto LAB_0064e32c;
          yych_2 = limit[8];
          if ((yych_2 != 'D') && (pbVar5 = (byte *)(limit + 8), yych_2 != 'd')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 9);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x164;
          goto LAB_0065871d;
        }
      }
      else {
        if (0x69 < yych_2) {
          if (yych_2 != 0x6f) goto LAB_0064e32c;
          goto LAB_0065177e;
        }
        if (yych_2 < 0x69) goto LAB_0064e32c;
      }
      yych_2 = limit[3];
      if ((yych_2 != 'V') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'v')) goto LAB_0064e32c;
      yych_2 = limit[4];
      if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'a')) goto LAB_0064e32c;
      yych_2 = limit[5];
      if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 5), yych_2 != 't')) goto LAB_0064e32c;
      yych_2 = limit[6];
      if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 6), yych_2 != 'e')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 7);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x165;
      goto LAB_0065871d;
    case 'R':
    case 'r':
      yych_2 = limit[1];
      if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 1), yych_2 != 'e')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 2);
      yych_2 = limit[2];
      if (yych_2 < 0x55) {
        if (yych_2 < 0x47) {
          if (yych_2 != 0x41) {
            if (yych_2 < 0x46) goto LAB_0064e32c;
LAB_00651820:
            pbVar5 = (byte *)(limit + 3);
            yych_2 = *pbVar5;
            if (yych_2 < 0x5b) {
              if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
            }
            else if (yych_2 < 0x60) {
              if (0x5e < yych_2) goto LAB_0064e30b;
            }
            else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
            this->TokenType = 0x15b;
            goto LAB_0065871d;
          }
LAB_006517ea:
          yych_2 = limit[3];
          if ((yych_2 != 'D') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'd')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'o')) goto LAB_0064e32c;
          yych_2 = limit[5];
          if ((yych_2 != 'N') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'n')) goto LAB_0064e32c;
          yych_2 = limit[6];
          if ((yych_2 != 'L') && (pbVar5 = (byte *)(limit + 6), yych_2 != 'l')) goto LAB_0064e32c;
          yych_2 = limit[7];
          if ((yych_2 != 'Y') && (pbVar5 = (byte *)(limit + 7), yych_2 != 'y')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 8);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x187;
          goto LAB_0065871d;
        }
        if (yych_2 != 0x50) {
          if (yych_2 < 0x54) goto LAB_0064e32c;
LAB_006518e7:
          yych_2 = limit[3];
          if ((yych_2 != 'U') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'u')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'r')) goto LAB_0064e32c;
          yych_2 = limit[5];
          if ((yych_2 != 'N') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'n')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 6);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x12f;
          goto LAB_0065871d;
        }
      }
      else {
        if (yych_2 < 0x67) {
          if (yych_2 != 0x61) {
            if (yych_2 < 0x66) goto LAB_0064e32c;
            goto LAB_00651820;
          }
          goto LAB_006517ea;
        }
        if (0x70 < yych_2) {
          if (yych_2 != 0x74) goto LAB_0064e32c;
          goto LAB_006518e7;
        }
        if (yych_2 < 0x70) goto LAB_0064e32c;
      }
      yych_2 = limit[3];
      if ((yych_2 != 'L') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'l')) goto LAB_0064e32c;
      yych_2 = limit[4];
      if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'a')) goto LAB_0064e32c;
      yych_2 = limit[5];
      if ((yych_2 != 'C') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'c')) goto LAB_0064e32c;
      yych_2 = limit[6];
      if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 6), yych_2 != 'e')) goto LAB_0064e32c;
      yych_2 = limit[7];
      if ((yych_2 != 'S') && (pbVar5 = (byte *)(limit + 7), yych_2 != 's')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 8);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x179;
      goto LAB_0065871d;
    case 'S':
    case 's':
      yych_2 = limit[1];
      switch(yych_2) {
      case 'B':
      case 'b':
        yych_2 = limit[2];
        if ((yych_2 != 'Y') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'y')) goto LAB_0064e32c;
        yych_2 = limit[3];
        if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 3), yych_2 != 't')) goto LAB_0064e32c;
        yych_2 = limit[4];
        if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'e')) goto LAB_0064e32c;
        pbVar5 = (byte *)(limit + 5);
        yych_2 = *pbVar5;
        if (yych_2 < 0x5b) {
          if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
        }
        else if (yych_2 < 0x60) {
          if (0x5e < yych_2) goto LAB_0064e30b;
        }
        else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
        this->TokenType = 0x139;
        goto LAB_0065871d;
      default:
        pbVar5 = (byte *)(limit + 1);
        goto LAB_0064e32c;
      case 'H':
      case 'h':
        yych_2 = limit[2];
        if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'o')) goto LAB_0064e32c;
        yych_2 = limit[3];
        if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'r')) goto LAB_0064e32c;
        yych_2 = limit[4];
        if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 4), yych_2 != 't')) goto LAB_0064e32c;
        pbVar5 = (byte *)(limit + 5);
        yych_2 = *pbVar5;
        if (yych_2 < 0x5b) {
          if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
        }
        else if (yych_2 < 0x60) {
          if (0x5e < yych_2) goto LAB_0064e30b;
        }
        else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
        this->TokenType = 0x13a;
        goto LAB_0065871d;
      case 'I':
      case 'i':
        goto LAB_006500b3;
      case 'L':
      case 'l':
        yych_2 = limit[2];
        if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'o')) goto LAB_0064e32c;
        yych_2 = limit[3];
        if ((yych_2 != 'W') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'w')) goto LAB_0064e32c;
        pbVar5 = (byte *)(limit + 4);
        yych_2 = *pbVar5;
        if (yych_2 < 0x5b) {
          if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
        }
        else if (yych_2 < 0x60) {
          if (0x5e < yych_2) goto LAB_0064e30b;
        }
        else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
        iVar8 = 0x101;
        if ((this->StateOptions & 1U) != 0) {
          iVar8 = 0x18d;
        }
        this->TokenType = iVar8;
        goto LAB_0065871d;
      case 'O':
      case 'o':
        yych_2 = limit[2];
        if ((yych_2 != 'U') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'u')) goto LAB_0064e32c;
        yych_2 = limit[3];
        if ((yych_2 != 'N') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'n')) goto LAB_0064e32c;
        yych_2 = limit[4];
        if ((yych_2 != 'D') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'd')) goto LAB_0064e32c;
        pbVar5 = (byte *)(limit + 5);
        yych_2 = *pbVar5;
        if (yych_2 < 0x5b) {
          if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
        }
        else if (yych_2 < 0x60) {
          if (0x5e < yych_2) goto LAB_0064e30b;
        }
        else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
        this->TokenType = 0x14a;
        goto LAB_0065871d;
      case 'T':
      case 't':
        pbVar5 = (byte *)(limit + 2);
        yych_2 = limit[2];
        if (yych_2 < 0x53) {
          if (0x4e < yych_2) {
            if (yych_2 < 0x50) {
LAB_00651a97:
              yych_2 = limit[3];
              if ((yych_2 != 'P') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'p'))
              goto LAB_0064e32c;
              pbVar5 = (byte *)(limit + 4);
              yych_2 = *pbVar5;
              if (yych_2 < 0x5b) {
                if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
              }
              else if (yych_2 < 0x60) {
                if (0x5e < yych_2) goto LAB_0064e30b;
              }
              else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
              this->TokenType = 0x176;
              goto LAB_0065871d;
            }
            if (yych_2 < 0x52) goto LAB_0064e32c;
LAB_00651acd:
            pbVar5 = (byte *)(limit + 3);
            yych_2 = limit[3];
            if (yych_2 < 0x56) {
              if (yych_2 != 0x49) {
                if (yych_2 < 0x55) goto LAB_0064e32c;
LAB_00653428:
                yych_2 = limit[4];
                if ((yych_2 != 'C') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'c'))
                goto LAB_0064e32c;
                yych_2 = limit[5];
                if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 5), yych_2 != 't'))
                goto LAB_0064e32c;
                pbVar5 = (byte *)(limit + 6);
                yych_2 = *pbVar5;
                if (yych_2 < 0x5b) {
                  if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
                }
                else if (yych_2 < 0x60) {
                  if (0x5e < yych_2) goto LAB_0064e30b;
                }
                else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
                this->TokenType = 0x145;
                goto LAB_0065871d;
              }
            }
            else {
              if (0x69 < yych_2) {
                if (yych_2 != 0x75) goto LAB_0064e32c;
                goto LAB_00653428;
              }
              if (yych_2 < 0x69) goto LAB_0064e32c;
            }
            yych_2 = limit[4];
            if ((yych_2 != 'N') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'n')) goto LAB_0064e32c;
            yych_2 = limit[5];
            if ((yych_2 != 'G') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'g')) goto LAB_0064e32c;
            pbVar5 = (byte *)(limit + 6);
            yych_2 = *pbVar5;
            if (yych_2 < 0x5b) {
              if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
            }
            else if (yych_2 < 0x60) {
              if (0x5e < yych_2) goto LAB_0064e30b;
            }
            else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
            this->TokenType = 0x149;
            goto LAB_0065871d;
          }
          if (yych_2 != 0x41) goto LAB_0064e32c;
        }
        else {
          if (0x6e < yych_2) {
            if (yych_2 < 0x70) goto LAB_00651a97;
            if (yych_2 != 0x72) goto LAB_0064e32c;
            goto LAB_00651acd;
          }
          if (yych_2 != 0x61) goto LAB_0064e32c;
        }
        yych_2 = limit[3];
        if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 3), yych_2 != 't')) goto LAB_0064e32c;
        pbVar5 = (byte *)(limit + 4);
        yych_2 = limit[4];
        if (yych_2 < 0x4a) {
          if (yych_2 != 0x45) {
            if (yych_2 < 0x49) goto LAB_0064e32c;
LAB_0065489e:
            yych_2 = limit[5];
            if ((yych_2 != 'C') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'c')) goto LAB_0064e32c;
            pbVar5 = (byte *)(limit + 6);
            yych_2 = *pbVar5;
            if (yych_2 < 0x5b) {
              if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
            }
            else if (yych_2 < 0x60) {
              if (0x5e < yych_2) goto LAB_0064e30b;
            }
            else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
            this->TokenType = 0x15d;
            goto LAB_0065871d;
          }
        }
        else {
          if (0x65 < yych_2) {
            if (yych_2 != 0x69) goto LAB_0064e32c;
            goto LAB_0065489e;
          }
          if (yych_2 < 0x65) goto LAB_0064e32c;
        }
        pbVar5 = (byte *)(limit + 5);
        yych_2 = *pbVar5;
        if (yych_2 < 0x5b) {
          if (0x40 < yych_2) {
            if (yych_2 != 0x53) goto LAB_0064e30b;
LAB_006559c1:
            pbVar5 = (byte *)(limit + 6);
            yych_2 = *pbVar5;
            if (yych_2 < 0x5b) {
              if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
            }
            else if (yych_2 < 0x60) {
              if (0x5e < yych_2) goto LAB_0064e30b;
            }
            else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
            this->TokenType = 0x181;
            goto LAB_0065871d;
          }
          if ((0x2f < yych_2) && (yych_2 < 0x3a)) goto LAB_0064e30b;
        }
        else if (yych_2 < 0x61) {
          if (yych_2 == 0x5f) goto LAB_0064e30b;
        }
        else {
          if (yych_2 == 0x73) goto LAB_006559c1;
          if (yych_2 < 0x7b) goto LAB_0064e30b;
        }
        this->TokenType = 0x14b;
        goto LAB_0065871d;
      case 'U':
      case 'u':
        yych_2 = limit[2];
        if ((yych_2 != 'P') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'p')) goto LAB_0064e32c;
        yych_2 = limit[3];
        if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'e')) goto LAB_0064e32c;
        yych_2 = limit[4];
        if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'r')) goto LAB_0064e32c;
        pbVar5 = (byte *)(limit + 5);
        yych_2 = *pbVar5;
        if (yych_2 < 0x5b) {
          if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
        }
        else if (yych_2 < 0x60) {
          if (0x5e < yych_2) goto LAB_0064e30b;
        }
        else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
        this->TokenType = 0x173;
        goto LAB_0065871d;
      case 'W':
      case 'w':
        yych_2 = limit[2];
        if ((yych_2 != 'I') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'i')) goto LAB_0064e32c;
        yych_2 = limit[3];
        if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 3), yych_2 != 't')) goto LAB_0064e32c;
        yych_2 = limit[4];
        if ((yych_2 != 'C') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'c')) goto LAB_0064e32c;
        yych_2 = limit[5];
        if ((yych_2 != 'H') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'h')) goto LAB_0064e32c;
        pbVar5 = (byte *)(limit + 6);
        yych_2 = *pbVar5;
        if (yych_2 < 0x5b) {
          if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
        }
        else if (yych_2 < 0x60) {
          if (0x5e < yych_2) goto LAB_0064e30b;
        }
        else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
        this->TokenType = 0x130;
        goto LAB_0065871d;
      }
    case 'T':
    case 't':
      pbVar5 = (byte *)(limit + 1);
      yych_2 = limit[1];
      if (yych_2 < 0x53) {
        if (yych_2 != 0x48) {
          if (yych_2 < 0x52) goto LAB_0064e32c;
LAB_006502c7:
          pbVar5 = (byte *)(limit + 2);
          yych_2 = limit[2];
          if (yych_2 < 0x56) {
            if (yych_2 != 0x41) {
              if (yych_2 < 0x55) goto LAB_0064e32c;
LAB_00651c13:
              yych_2 = limit[3];
              if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'e'))
              goto LAB_0064e32c;
              pbVar5 = (byte *)(limit + 4);
              yych_2 = *pbVar5;
              if (yych_2 < 0x5b) {
                if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
              }
              else if (yych_2 < 0x60) {
                if (0x5e < yych_2) goto LAB_0064e30b;
              }
              else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
              this->TokenType = 0x150;
              goto LAB_0065871d;
            }
          }
          else {
            if (0x61 < yych_2) {
              if (yych_2 != 0x75) goto LAB_0064e32c;
              goto LAB_00651c13;
            }
            if (yych_2 < 0x61) goto LAB_0064e32c;
          }
          yych_2 = limit[3];
          if ((yych_2 != 'N') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'n')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'S') && (pbVar5 = (byte *)(limit + 4), yych_2 != 's')) goto LAB_0064e32c;
          yych_2 = limit[5];
          if ((yych_2 != 'I') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'i')) goto LAB_0064e32c;
          yych_2 = limit[6];
          if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 6), yych_2 != 'e')) goto LAB_0064e32c;
          yych_2 = limit[7];
          if ((yych_2 != 'N') && (pbVar5 = (byte *)(limit + 7), yych_2 != 'n')) goto LAB_0064e32c;
          yych_2 = limit[8];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 8), yych_2 != 't')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 9);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x15e;
          goto LAB_0065871d;
        }
      }
      else {
        if (0x68 < yych_2) {
          if (yych_2 != 0x72) goto LAB_0064e32c;
          goto LAB_006502c7;
        }
        if (yych_2 < 0x68) goto LAB_0064e32c;
      }
      yych_2 = limit[2];
      if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'r')) goto LAB_0064e32c;
      yych_2 = limit[3];
      if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'o')) goto LAB_0064e32c;
      yych_2 = limit[4];
      if ((yych_2 != 'W') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'w')) goto LAB_0064e32c;
      yych_2 = limit[5];
      if ((yych_2 != 'S') && (pbVar5 = (byte *)(limit + 5), yych_2 != 's')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 6);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x161;
      goto LAB_0065871d;
    case 'U':
    case 'u':
      yych_2 = limit[1];
      switch(yych_2) {
      case 'I':
      case 'i':
        goto LAB_00650335;
      default:
        pbVar5 = (byte *)(limit + 1);
        goto LAB_0064e32c;
      case 'L':
      case 'l':
        yych_2 = limit[2];
        if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'o')) goto LAB_0064e32c;
        yych_2 = limit[3];
        if ((yych_2 != 'N') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'n')) goto LAB_0064e32c;
        yych_2 = limit[4];
        if ((yych_2 != 'G') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'g')) goto LAB_0064e32c;
        pbVar5 = (byte *)(limit + 5);
        yych_2 = *pbVar5;
        if (yych_2 < 0x5b) {
          if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
        }
        else if (yych_2 < 0x60) {
          if (0x5e < yych_2) goto LAB_0064e30b;
        }
        else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
        this->TokenType = 0x143;
        goto LAB_0065871d;
      case 'N':
      case 'n':
        yych_2 = limit[2];
        if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 2), yych_2 != 't')) goto LAB_0064e32c;
        yych_2 = limit[3];
        if ((yych_2 != 'I') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'i')) goto LAB_0064e32c;
        yych_2 = limit[4];
        if ((yych_2 != 'L') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'l')) goto LAB_0064e32c;
        pbVar5 = (byte *)(limit + 5);
        yych_2 = *pbVar5;
        if (yych_2 < 0x5b) {
          if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
        }
        else if (yych_2 < 0x60) {
          if (0x5e < yych_2) goto LAB_0064e30b;
        }
        else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
        this->TokenType = 0x131;
        goto LAB_0065871d;
      case 'S':
      case 's':
        yych_2 = limit[2];
        if ((yych_2 != 'H') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'h')) goto LAB_0064e32c;
        yych_2 = limit[3];
        if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'o')) goto LAB_0064e32c;
        yych_2 = limit[4];
        if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'r')) goto LAB_0064e32c;
        yych_2 = limit[5];
        if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 5), yych_2 != 't')) goto LAB_0064e32c;
        pbVar5 = (byte *)(limit + 6);
        yych_2 = *pbVar5;
        if (yych_2 < 0x5b) {
          if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
        }
        else if (yych_2 < 0x60) {
          if (0x5e < yych_2) goto LAB_0064e30b;
        }
        else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
        this->TokenType = 0x13b;
        goto LAB_0065871d;
      }
    case 'V':
    case 'v':
      pbVar5 = (byte *)(limit + 1);
      yych_2 = limit[1];
      if (yych_2 < 0x50) {
        if (yych_2 < 0x46) {
          if (yych_2 == 0x41) goto LAB_0065040d;
          if (yych_2 < 0x45) goto LAB_0064e32c;
          goto LAB_00650443;
        }
        if (yych_2 == 0x49) goto LAB_00650479;
        if (yych_2 < 0x4f) goto LAB_0064e32c;
      }
      else {
        if (yych_2 < 0x66) {
          if (yych_2 == 0x61) {
LAB_0065040d:
            yych_2 = limit[2];
            if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'r')) goto LAB_0064e32c;
            pbVar5 = (byte *)(limit + 3);
            yych_2 = *pbVar5;
            if (yych_2 < 0x5b) {
              if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
            }
            else if (yych_2 < 0x60) {
              if (0x5e < yych_2) goto LAB_0064e30b;
            }
            else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
            this->TokenType = 0x159;
            goto LAB_0065871d;
          }
          if (yych_2 < 0x65) goto LAB_0064e32c;
LAB_00650443:
          yych_2 = limit[2];
          if ((yych_2 != 'C') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'c')) goto LAB_0064e32c;
          yych_2 = limit[3];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 3), yych_2 != 't')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'o')) goto LAB_0064e32c;
          yych_2 = limit[5];
          if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'r')) goto LAB_0064e32c;
          yych_2 = limit[6];
          pbVar5 = (byte *)(limit + 6);
          if (yych_2 < 0x32) goto LAB_0064e32c;
          if (yych_2 < 0x33) {
            pbVar5 = (byte *)(limit + 7);
            yych_2 = *pbVar5;
            if (yych_2 < 0x5b) {
              if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
            }
            else if (yych_2 < 0x60) {
              if (0x5e < yych_2) goto LAB_0064e30b;
            }
            else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
            this->TokenType = 0x17a;
          }
          else {
            if (0x33 < yych_2) goto LAB_0064e32c;
            pbVar5 = (byte *)(limit + 7);
            yych_2 = *pbVar5;
            if (yych_2 < 0x5b) {
              if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
            }
            else if (yych_2 < 0x60) {
              if (0x5e < yych_2) goto LAB_0064e30b;
            }
            else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
            this->TokenType = 0x17b;
          }
          goto LAB_0065871d;
        }
        if (yych_2 < 0x6a) {
          if (yych_2 < 0x69) goto LAB_0064e32c;
LAB_00650479:
          yych_2 = limit[2];
          if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'r')) goto LAB_0064e32c;
          yych_2 = limit[3];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 3), yych_2 != 't')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'U') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'u')) goto LAB_0064e32c;
          yych_2 = limit[5];
          if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'a')) goto LAB_0064e32c;
          yych_2 = limit[6];
          if ((yych_2 != 'L') && (pbVar5 = (byte *)(limit + 6), yych_2 != 'l')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 7);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x171;
          goto LAB_0065871d;
        }
        if (yych_2 != 0x6f) goto LAB_0064e32c;
      }
      pbVar5 = (byte *)(limit + 2);
      yych_2 = limit[2];
      if (yych_2 < 0x4d) {
        if (yych_2 != 0x49) {
          if (yych_2 < 0x4c) goto LAB_0064e32c;
LAB_00651e54:
          yych_2 = limit[3];
          if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'a')) goto LAB_0064e32c;
          yych_2 = limit[4];
          if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 4), yych_2 != 't')) goto LAB_0064e32c;
          yych_2 = limit[5];
          if ((yych_2 != 'I') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'i')) goto LAB_0064e32c;
          yych_2 = limit[6];
          if ((yych_2 != 'L') && (pbVar5 = (byte *)(limit + 6), yych_2 != 'l')) goto LAB_0064e32c;
          yych_2 = limit[7];
          if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 7), yych_2 != 'e')) goto LAB_0064e32c;
          pbVar5 = (byte *)(limit + 8);
          yych_2 = *pbVar5;
          if (yych_2 < 0x5b) {
            if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
          }
          else if (yych_2 < 0x60) {
            if (0x5e < yych_2) goto LAB_0064e30b;
          }
          else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
          this->TokenType = 0x15f;
          goto LAB_0065871d;
        }
      }
      else {
        if (0x69 < yych_2) {
          if (yych_2 != 0x6c) goto LAB_0064e32c;
          goto LAB_00651e54;
        }
        if (yych_2 < 0x69) goto LAB_0064e32c;
      }
      yych_2 = limit[3];
      if ((yych_2 != 'D') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'd')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 4);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x144;
      goto LAB_0065871d;
    case 'W':
    case 'w':
      yych_2 = limit[1];
      if ((yych_2 != 'H') && (pbVar5 = (byte *)(limit + 1), yych_2 != 'h')) goto LAB_0064e32c;
      yych_2 = limit[2];
      if ((yych_2 != 'I') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'i')) goto LAB_0064e32c;
      yych_2 = limit[3];
      if ((yych_2 != 'L') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'l')) goto LAB_0064e32c;
      yych_2 = limit[4];
      if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'e')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 5);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x132;
      goto LAB_0065871d;
    case '[':
      this->TokenType = 0x5b;
      pbVar5 = (byte *)(limit + 1);
      goto LAB_0065871d;
    case ']':
      this->TokenType = 0x5d;
      pbVar5 = (byte *)(limit + 1);
      goto LAB_0065871d;
    case '^':
      yych_2 = limit[1];
      if (yych_2 == '=') {
        this->TokenType = 0x114;
        pbVar5 = (byte *)(limit + 2);
      }
      else {
        this->TokenType = 0x5e;
        pbVar5 = (byte *)(limit + 1);
      }
      goto LAB_0065871d;
    case '{':
      this->StateOptions = false;
      this->TokenType = 0x7b;
      pbVar5 = (byte *)(limit + 1);
      goto LAB_0065871d;
    case '|':
      yych_2 = limit[1];
      if (yych_2 == '=') {
        this->TokenType = 0x115;
        pbVar5 = (byte *)(limit + 2);
      }
      else if (yych_2 == '|') {
        this->TokenType = 0x11c;
        pbVar5 = (byte *)(limit + 2);
      }
      else {
        this->TokenType = 0x7c;
        pbVar5 = (byte *)(limit + 1);
      }
      goto LAB_0065871d;
    case '}':
      this->TokenType = 0x7d;
      pbVar5 = (byte *)(limit + 1);
      goto LAB_0065871d;
    case '~':
      yyaccept_2 = 4;
      tok = limit + 1;
      yych_2 = limit[1];
      if (yych_2 != '=') goto LAB_0064eadf;
      yych_2 = limit[2];
      if (yych_2 != '=') goto LAB_0064ebdb;
      this->TokenType = 0x121;
      pbVar5 = (byte *)(limit + 3);
      goto LAB_0065871d;
    }
  }
LAB_006586e2:
  if (_yyaccept <= limit) {
    this->ScriptPtr = this->ScriptEndPtr;
    cursor._7_1_ = false;
    goto LAB_00658c2b;
  }
  this->Line = this->Line + 1;
  this->Crossed = true;
  goto LAB_0064c6e3;
  while (yych_1 < 0x21) {
LAB_0064c8c6:
    limit = limit + 1;
    yych_1 = *limit;
    if (yych_1 == 10) break;
  }
  goto LAB_0064c6e3;
LAB_0064c9ad:
  limit = limit + 1;
  cVar1 = *limit;
  pcVar9 = limit;
  if (cVar1 != '\"') {
    while (limit = pcVar9, cVar1 == '\\') {
      while( true ) {
        cVar1 = limit[1];
        pcVar9 = limit + 1;
        if (cVar1 != '\"') break;
        yyaccept_1 = 1;
        limit = limit + 2;
        tok = limit;
        if (*limit == '\"') goto LAB_0064cd49;
        if (*limit != '\\') goto LAB_0064c9ad;
      }
    }
    goto LAB_0064c9ad;
  }
LAB_0064cd49:
  yych_1 = '\"';
  limit = limit + 1;
LAB_0064cd55:
  this->TokenType = 0x102;
  pbVar5 = (byte *)limit;
  goto LAB_0065871d;
LAB_0064ce1e:
  do {
    limit = (char *)pbVar5;
    pbVar5 = (byte *)(limit + 1);
  } while (limit[1] != '\n');
  limit = limit + 2;
  yych_1 = '\n';
  goto LAB_006586e2;
LAB_0064d4c2:
  do {
    yyaccept_1 = 0;
    tok = limit + 1;
    bVar2 = *tok;
    if (0x2e < bVar2) {
      pbVar5 = (byte *)tok;
      if (bVar2 < 0x3c) {
        if (0x2f < bVar2) {
          limit = tok;
          if (0x39 < bVar2) break;
          goto LAB_0064d4c2;
        }
        pbVar5 = (byte *)(limit + 2);
        bVar2 = *pbVar5;
        limit = (char *)pbVar5;
        if (bVar2 < 0x2b) {
          if (bVar2 < 0x21) goto joined_r0x0064d5ca;
          if ((bVar2 == 0x22) || (0x29 < bVar2)) break;
          goto LAB_0064d4c2;
        }
        if (bVar2 < 0x3a) {
          if (bVar2 == 0x2f) break;
          goto LAB_0064d4c2;
        }
        if (bVar2 < 0x3c) break;
      }
      limit = (char *)pbVar5;
      if (bVar2 == 0x7d) break;
      goto LAB_0064d4c2;
    }
    limit = (char *)(byte *)tok;
    if (bVar2 < 0x21) {
joined_r0x0064d5ca:
      if (bVar2 == 10) goto LAB_0064d57f;
      break;
    }
    limit = tok;
  } while (bVar2 != 0x22);
  do {
    limit = limit + 1;
  } while (*limit != '\n');
LAB_0064d57f:
  yych_1 = '\n';
  limit = limit + 1;
  goto LAB_006586e2;
LAB_0064c941:
  if (yych_1 < 0x30) {
    if (yych_1 < 0x22) {
      pbVar5 = (byte *)tok;
      if (yych_1 < 0x21) goto LAB_0064c8b3;
    }
    else {
      if (yych_1 < 0x23) goto LAB_0064c8b3;
      pbVar5 = (byte *)tok;
      if (0x2e < yych_1) {
        pbVar5 = (byte *)(tok + 1);
        yych_1 = *pbVar5;
        if (yych_1 < 0x2f) {
          if (yych_1 < 0x23) {
            if (yych_1 != 0x21) goto LAB_0064cab4;
          }
          else if (yych_1 == 0x2a) goto LAB_0064cab4;
        }
        else if (yych_1 < 0x3c) {
          if ((yych_1 < 0x30) || (0x39 < yych_1)) goto LAB_0064cab4;
        }
        else if (yych_1 == 0x7d) goto LAB_0064cab4;
      }
    }
  }
  else if (yych_1 < 0x3c) {
    pbVar5 = (byte *)tok;
    if (0x39 < yych_1) goto LAB_0064c8b3;
  }
  else {
    pbVar5 = (byte *)tok;
    if (yych_1 == '}') goto LAB_0064c8b3;
  }
LAB_0064c915:
  limit = (char *)pbVar5;
  yyaccept_1 = 0;
  yych_1 = limit[1];
  tok = limit + 1;
  goto LAB_0064c941;
LAB_0064cab4:
  limit = tok;
  if (yyaccept_1 < 4) {
    if (yyaccept_1 < 2) {
      if (yyaccept_1 != 0) goto LAB_0064cd55;
LAB_0064c8b3:
      this->TokenType = 0x107;
      pbVar5 = (byte *)tok;
    }
    else if (yyaccept_1 == 2) {
LAB_0064d267:
      this->TokenType = 0x183;
      pbVar5 = (byte *)tok;
    }
    else {
LAB_0064d2de:
      this->StateMode = '\0';
      this->StateOptions = false;
      this->TokenType = 0x14d;
      pbVar5 = (byte *)tok;
    }
  }
  else if (yyaccept_1 < 6) {
    if (yyaccept_1 == 4) {
LAB_0064d363:
      this->TokenType = 0x182;
      pbVar5 = (byte *)tok;
    }
    else {
LAB_0064d3da:
      this->TokenType = 0x176;
      pbVar5 = (byte *)tok;
    }
  }
  else {
LAB_0064d451:
    this->TokenType = 0x184;
    pbVar5 = (byte *)tok;
  }
  goto LAB_0065871d;
LAB_00650335:
  yych_2 = limit[2];
  if ((yych_2 != 'N') && (pbVar5 = (byte *)(limit + 2), yych_2 != 'n')) goto LAB_0064e32c;
  yych_2 = limit[3];
  if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 3), yych_2 != 't')) goto LAB_0064e32c;
  pbVar5 = (byte *)(limit + 4);
  yych_2 = *pbVar5;
  if (yych_2 < 0x3a) {
    if (0x31 < yych_2) {
      if (yych_2 != 0x38) goto LAB_0064e30b;
      pbVar5 = (byte *)(limit + 5);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x13d;
      goto LAB_0065871d;
    }
    if (0x2f < yych_2) {
      if (yych_2 < 0x31) goto LAB_0064e30b;
      yych_2 = limit[5];
      pbVar5 = (byte *)(limit + 5);
      if (yych_2 != '6') goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 6);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x13f;
      goto LAB_0065871d;
    }
  }
  else if (yych_2 < 0x5f) {
    if ((0x40 < yych_2) && (yych_2 < 0x5b)) goto LAB_0064e30b;
  }
  else if ((yych_2 != 0x60) && (yych_2 < 0x7b)) goto LAB_0064e30b;
  this->TokenType = 0x141;
  goto LAB_0065871d;
LAB_006500b3:
  pbVar5 = (byte *)(limit + 2);
  yych_2 = limit[2];
  if (yych_2 < 0x5b) {
    if (yych_2 != 0x4e) {
      if (yych_2 < 0x5a) goto LAB_0064e32c;
LAB_006519bf:
      yych_2 = limit[3];
      if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'e')) goto LAB_0064e32c;
      yych_2 = limit[4];
      if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'o')) goto LAB_0064e32c;
      yych_2 = limit[5];
      if ((yych_2 != 'F') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'f')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 6);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x17f;
      goto LAB_0065871d;
    }
  }
  else {
    if (0x6e < yych_2) {
      if (yych_2 != 0x7a) goto LAB_0064e32c;
      goto LAB_006519bf;
    }
    if (yych_2 < 0x6e) goto LAB_0064e32c;
  }
  yych_2 = limit[3];
  if ((yych_2 != 'G') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'g')) goto LAB_0064e32c;
  yych_2 = limit[4];
  if ((yych_2 != 'U') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'u')) goto LAB_0064e32c;
  yych_2 = limit[5];
  if ((yych_2 != 'L') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'l')) goto LAB_0064e32c;
  yych_2 = limit[6];
  if ((yych_2 != 'A') && (pbVar5 = (byte *)(limit + 6), yych_2 != 'a')) goto LAB_0064e32c;
  yych_2 = limit[7];
  if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 7), yych_2 != 'r')) goto LAB_0064e32c;
  pbVar5 = (byte *)(limit + 8);
  yych_2 = *pbVar5;
  if (yych_2 < 0x5b) {
    if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
  }
  else if (yych_2 < 0x60) {
    if (0x5e < yych_2) goto LAB_0064e30b;
  }
  else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
  this->TokenType = 0x16b;
  goto LAB_0065871d;
LAB_0064f730:
  pbVar5 = (byte *)(limit + 2);
  yych_2 = limit[2];
  if (yych_2 < 0x55) {
    if (yych_2 < 0x50) {
      if (yych_2 != 0x45) goto LAB_0064e32c;
LAB_00650ed9:
      yych_2 = limit[3];
      if ((yych_2 != 'C') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'c')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 4);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x156;
      goto LAB_0065871d;
    }
    if (0x50 < yych_2) {
      if (yych_2 < 0x54) goto LAB_0064e32c;
LAB_00650f45:
      yych_2 = limit[3];
      if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'e')) goto LAB_0064e32c;
      yych_2 = limit[4];
      if ((yych_2 != 'N') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'n')) goto LAB_0064e32c;
      yych_2 = limit[5];
      if ((yych_2 != 'D') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'd')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 6);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x162;
      goto LAB_0065871d;
    }
  }
  else {
    if (yych_2 < 0x70) {
      if (yych_2 != 0x65) goto LAB_0064e32c;
      goto LAB_00650ed9;
    }
    if (0x70 < yych_2) {
      if (yych_2 != 0x74) goto LAB_0064e32c;
      goto LAB_00650f45;
    }
  }
  yych_2 = limit[3];
  if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'o')) goto LAB_0064e32c;
  yych_2 = limit[4];
  if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'r')) goto LAB_0064e32c;
  yych_2 = limit[5];
  if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 5), yych_2 != 't')) goto LAB_0064e32c;
  pbVar5 = (byte *)(limit + 6);
  yych_2 = *pbVar5;
  if (yych_2 < 0x5b) {
    if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
  }
  else if (yych_2 < 0x60) {
    if (0x5e < yych_2) goto LAB_0064e30b;
  }
  else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
  this->TokenType = 0x170;
  goto LAB_0065871d;
LAB_0064f473:
  pbVar5 = (byte *)(limit + 2);
  yych_2 = limit[2];
  if (yych_2 < 0x4f) {
    if (yych_2 < 0x4c) {
      if (yych_2 != 0x45) goto LAB_0064e32c;
      goto LAB_00650bca;
    }
    if (yych_2 < 0x4d) goto LAB_00650c00;
    if (yych_2 < 0x4e) goto LAB_0064e32c;
  }
  else {
    if (yych_2 < 0x6c) {
      if (yych_2 != 0x65) goto LAB_0064e32c;
LAB_00650bca:
      yych_2 = limit[3];
      if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'r')) goto LAB_0064e32c;
      yych_2 = limit[4];
      if ((yych_2 != 'C') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'c')) goto LAB_0064e32c;
      yych_2 = limit[5];
      if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'e')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 6);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x16d;
      goto LAB_0065871d;
    }
    if (yych_2 < 0x6d) {
LAB_00650c00:
      yych_2 = limit[3];
      if ((yych_2 != 'O') && (pbVar5 = (byte *)(limit + 3), yych_2 != 'o')) goto LAB_0064e32c;
      yych_2 = limit[4];
      if ((yych_2 != 'R') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'r')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 5);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x14c;
      goto LAB_0065871d;
    }
    if (yych_2 != 0x6e) goto LAB_0064e32c;
  }
  pbVar5 = (byte *)(limit + 3);
  yych_2 = limit[3];
  if (yych_2 < 0x55) {
    if (yych_2 < 0x47) {
      if (yych_2 < 0x46) goto LAB_0064e32c;
      goto LAB_00652475;
    }
    if (yych_2 < 0x53) goto LAB_0064e32c;
    if (yych_2 < 0x54) goto LAB_006524ab;
  }
  else {
    if (yych_2 < 0x73) {
      if (yych_2 != 0x66) goto LAB_0064e32c;
LAB_00652475:
      yych_2 = limit[4];
      if ((yych_2 != 'I') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'i')) goto LAB_0064e32c;
      yych_2 = limit[5];
      if ((yych_2 != 'G') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'g')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 6);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x16c;
      goto LAB_0065871d;
    }
    if (yych_2 < 0x74) {
LAB_006524ab:
      yych_2 = limit[4];
      if ((yych_2 != 'T') && (pbVar5 = (byte *)(limit + 4), yych_2 != 't')) goto LAB_0064e32c;
      pbVar5 = (byte *)(limit + 5);
      yych_2 = *pbVar5;
      if (yych_2 < 0x5b) {
        if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
      }
      else if (yych_2 < 0x60) {
        if (0x5e < yych_2) goto LAB_0064e30b;
      }
      else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
      this->TokenType = 0x128;
      goto LAB_0065871d;
    }
    if (0x74 < yych_2) goto LAB_0064e32c;
  }
  yych_2 = limit[4];
  if ((yych_2 != 'I') && (pbVar5 = (byte *)(limit + 4), yych_2 != 'i')) goto LAB_0064e32c;
  yych_2 = limit[5];
  if ((yych_2 != 'N') && (pbVar5 = (byte *)(limit + 5), yych_2 != 'n')) goto LAB_0064e32c;
  yych_2 = limit[6];
  if ((yych_2 != 'U') && (pbVar5 = (byte *)(limit + 6), yych_2 != 'u')) goto LAB_0064e32c;
  yych_2 = limit[7];
  if ((yych_2 != 'E') && (pbVar5 = (byte *)(limit + 7), yych_2 != 'e')) goto LAB_0064e32c;
  pbVar5 = (byte *)(limit + 8);
  yych_2 = *pbVar5;
  if (yych_2 < 0x5b) {
    if ((0x2f < yych_2) && ((yych_2 < 0x3a || (0x40 < yych_2)))) goto LAB_0064e30b;
  }
  else if (yych_2 < 0x60) {
    if (0x5e < yych_2) goto LAB_0064e30b;
  }
  else if ((0x60 < yych_2) && (yych_2 < 0x7b)) goto LAB_0064e30b;
  this->TokenType = 0x129;
  goto LAB_0065871d;
LAB_0064e30b:
  limit = (char *)pbVar5;
  yych_2 = limit[1];
  pbVar5 = (byte *)(limit + 1);
LAB_0064e32c:
  limit = (char *)pbVar5;
  pbVar5 = (byte *)limit;
  if (yych_2 < 0x5b) {
    if ((yych_2 < 0x30) || ((0x39 < yych_2 && (yych_2 < 0x41)))) goto LAB_0064e014;
    goto LAB_0064e30b;
  }
  if (yych_2 < 0x60) {
    if (yych_2 < 0x5f) goto LAB_0064e014;
  }
  else if ((yych_2 < 0x61) || (0x7a < yych_2)) goto LAB_0064e014;
  goto LAB_0064e30b;
LAB_0064e014:
  this->TokenType = 0x101;
  goto LAB_0065871d;
LAB_0064dcca:
  yyaccept_2 = 2;
  limit = limit + 1;
  yych_2 = *limit;
  pbVar5 = (byte *)limit;
  tok = limit;
  if (0x4c < yych_2) goto LAB_0064dd4b;
  if (0x39 < yych_2) {
    if (yych_2 == 0x45) goto LAB_0064ef4c;
    if (0x4b < yych_2) goto LAB_0064efac;
    goto LAB_0064dcb7;
  }
  if (yych_2 == 0x2e) goto LAB_0064ee3b;
  if (yych_2 < 0x30) goto LAB_0064dcb7;
  goto LAB_0064dcca;
LAB_0064dd4b:
  if (0x65 < yych_2) {
    if (0x6c < yych_2) goto joined_r0x0064dd98;
    if (0x6b < yych_2) goto LAB_0064efac;
    goto LAB_0064dcb7;
  }
  if (yych_2 == 0x55) goto LAB_0064efac;
  if (yych_2 < 0x65) goto LAB_0064dcb7;
LAB_0064ef4c:
  limit = tok + 1;
  yych_2 = tok[1];
  if (yych_2 < 0x2d) {
    if (yych_2 != 0x2b) goto LAB_0064ebdb;
LAB_006506f5:
    limit = tok + 2;
    yych_2 = tok[2];
  }
  else if (yych_2 < 0x2e) goto LAB_006506f5;
  if ((0x2f < yych_2) && (yych_2 < 0x3a)) goto LAB_00650728;
LAB_0064ebdb:
  limit = tok;
  if (3 < yyaccept_2) {
    if (5 < yyaccept_2) goto LAB_0064eb56;
    if (yyaccept_2 != 4) goto LAB_0064eed8;
LAB_0064eadf:
    this->TokenType = 0x7e;
    pbVar5 = (byte *)tok;
    goto LAB_0065871d;
  }
  if (1 < yyaccept_2) {
    pbVar5 = (byte *)limit;
    if (yyaccept_2 == 2) goto LAB_0064dcb7;
LAB_0064de56:
    this->TokenType = 0x3c;
    pbVar5 = (byte *)tok;
    goto LAB_0065871d;
  }
  pcVar9 = limit;
  if (yyaccept_2 != 0) goto LAB_0064db8d;
LAB_0064d798:
  limit = pcVar9;
  ScriptError(this,"Unexpected character: %c (ASCII %d)\n",(ulong)(uint)(int)*pcVar6,
              (ulong)(uint)(int)*pcVar6);
  goto LAB_0064c6e3;
LAB_006507ab:
  limit = limit + 1;
  yych_2 = *limit;
  pbVar5 = (byte *)limit;
  if (0x54 < yych_2) {
    if (0x6b < yych_2) {
      if (0x6c < yych_2) goto joined_r0x0064dd98;
      goto LAB_0064efac;
    }
    if (yych_2 < 0x56) goto LAB_0064efac;
    if ((yych_2 < 0x61) || (0x66 < yych_2)) goto LAB_0064dcb7;
    goto LAB_006507ab;
  }
  if (yych_2 < 0x41) {
    if ((yych_2 < 0x30) || (0x39 < yych_2)) goto LAB_0064dcb7;
  }
  else if (0x46 < yych_2) {
    if (yych_2 == 0x4c) goto LAB_0064efac;
    goto LAB_0064dcb7;
  }
  goto LAB_006507ab;
joined_r0x0064dd98:
  yyaccept_2 = 2;
  pbVar5 = (byte *)limit;
  if (yych_2 == 0x75) {
LAB_0064efac:
    yyaccept_2 = 2;
    pbVar5 = (byte *)(limit + 1);
    yych_2 = limit[1];
    if (yych_2 < 0x56) {
      if ((yych_2 == 0x4c) || (0x54 < yych_2)) goto LAB_00650791;
    }
    else if (yych_2 < 0x6d) {
      if (0x6b < yych_2) {
LAB_00650791:
        yych_2 = limit[2];
        pbVar5 = (byte *)(limit + 2);
      }
    }
    else if (yych_2 == 0x75) goto LAB_00650791;
  }
LAB_0064dcb7:
  limit = (char *)pbVar5;
  this->TokenType = 0x104;
  pbVar5 = (byte *)limit;
  goto LAB_0065871d;
LAB_0064eefc:
  do {
    limit = pcVar9;
    pcVar9 = limit + 1;
  } while (limit[1] != '\n');
  limit = limit + 2;
  yych_2 = '\n';
  goto LAB_006586e2;
  while( true ) {
    if (yych_2 < 0x30) goto LAB_0064eed8;
    if (0x39 < yych_2) break;
LAB_0064ee3b:
    yyaccept_2 = 5;
    limit = limit + 1;
    yych_2 = *limit;
    tok = limit;
    if (0x45 < yych_2) {
      if (yych_2 < 0x65) {
        if (yych_2 < 0x47) goto LAB_006506ca;
        goto LAB_0064eed8;
      }
      if (yych_2 < 0x66) goto LAB_0064ef4c;
      if (yych_2 < 0x67) goto LAB_006506ca;
      goto LAB_0064eed8;
    }
  }
  if (yych_2 < 0x45) goto LAB_0064eed8;
  goto LAB_0064ef4c;
LAB_00650728:
  limit = limit + 1;
  yych_2 = *limit;
  if (yych_2 < 0x46) {
    if ((yych_2 < 0x30) || (0x39 < yych_2)) goto LAB_0064eed8;
    goto LAB_00650728;
  }
  if ((yych_2 < 0x47) || (yych_2 == 0x66)) {
LAB_006506ca:
    yych_2 = limit[1];
    limit = limit + 1;
  }
LAB_0064eed8:
  this->TokenType = 0x106;
  pbVar5 = (byte *)limit;
  goto LAB_0065871d;
LAB_0064ecf5:
  if (yych_2 == '\n') goto LAB_0064ebdb;
  if (yych_2 == '\'') {
    this->TokenType = 0x103;
    pbVar5 = (byte *)(limit + 1);
    goto LAB_0065871d;
  }
  yych_2 = limit[1];
  limit = limit + 1;
  goto LAB_0064ecf5;
LAB_0064db8d:
  this->TokenType = 0x2f;
  pbVar5 = (byte *)tok;
  goto LAB_0065871d;
LAB_0064eb56:
  this->TokenType = 0x102;
  pbVar5 = (byte *)limit;
  goto LAB_0065871d;
  while (yych_2 == 9) {
LAB_0064d7c0:
    limit = limit + 1;
    yych_2 = *limit;
    if (10 < yych_2) {
      if ((0xd < yych_2) && (yych_2 != 0x20)) break;
      goto LAB_0064d7c0;
    }
  }
  goto LAB_0064c6e3;
  while (yych_3 < 0x21) {
LAB_0065741a:
    limit = limit + 1;
    yych_3 = *limit;
    if (yych_3 == 10) break;
  }
  goto LAB_0064c6e3;
LAB_00657495:
  yyaccept_3 = 0;
  limit = tok;
  if (yych_3 < 0x3b) {
    if (yych_3 < 0x23) {
      pbVar5 = (byte *)tok;
      if (yych_3 != '!') goto LAB_0065871d;
    }
    else if (yych_3 == '/') {
      limit = tok + 1;
      yych_3 = *limit;
      if (yych_3 < 0x30) {
        if (yych_3 < 0x23) {
          if (yych_3 != 0x21) goto LAB_006576df;
        }
        else if ((yych_3 == 0x2a) || (0x2e < yych_3)) {
LAB_006576df:
          pbVar5 = (byte *)tok;
          goto LAB_0065871d;
        }
      }
      else if (yych_3 < 0x3d) {
        if (yych_3 == 0x3b) goto LAB_006576df;
      }
      else if ((yych_3 < 0x3e) || ((0x7a < yych_3 && (yych_3 < 0x7e)))) goto LAB_006576df;
    }
  }
  else if (yych_3 < 0x3e) {
    pbVar5 = (byte *)tok;
    if (yych_3 != '<') goto LAB_0065871d;
  }
  else if ((0x7a < yych_3) && (pbVar5 = (byte *)tok, yych_3 < 0x7e)) goto LAB_0065871d;
LAB_00657469:
  yych_3 = limit[1];
  tok = limit + 1;
  goto LAB_00657495;
LAB_006578ca:
  do {
    limit = (char *)pbVar5;
    yyaccept_3 = 0;
    tok = limit + 1;
    bVar2 = *tok;
    if (bVar2 < 0x30) {
      if (bVar2 < 0x21) {
        pbVar5 = (byte *)tok;
        limit = tok;
        if (bVar2 == 10) goto LAB_006579a6;
        break;
      }
      pbVar5 = (byte *)tok;
      if (bVar2 == 0x22) break;
      if (0x2e < bVar2) {
        limit = limit + 2;
        bVar2 = *limit;
        if (bVar2 < 0x2f) {
          pbVar5 = (byte *)limit;
          if (bVar2 < 0x22) {
            if (bVar2 == 10) goto LAB_006579a6;
            if (bVar2 < 0x21) break;
          }
          else if ((bVar2 < 0x23) || (bVar2 == 0x2a)) break;
        }
        else {
          if (bVar2 < 0x3d) {
            pbVar5 = (byte *)limit;
            if (0x2f < bVar2) goto joined_r0x00657a47;
            break;
          }
          pbVar5 = (byte *)limit;
          if (bVar2 < 0x3e) break;
joined_r0x0065795d:
          pbVar5 = (byte *)limit;
          if ((0x7a < bVar2) && (bVar2 < 0x7e)) break;
        }
      }
      goto LAB_006578ca;
    }
    limit = tok;
    if (0x3c < bVar2) {
      pbVar5 = (byte *)tok;
      if (0x3d < bVar2) goto joined_r0x0065795d;
      break;
    }
joined_r0x00657a47:
    pbVar5 = (byte *)limit;
  } while (bVar2 != 0x3b);
  do {
    limit = (char *)pbVar5;
    limit = limit + 1;
    pbVar5 = (byte *)limit;
  } while (*limit != '\n');
LAB_006579a6:
  yych_3 = '\n';
  limit = limit + 1;
  goto LAB_006586e2;
LAB_00657d74:
  pbVar5 = (byte *)(limit + 1);
  this->TokenType = 0x2d;
  if ((_yyaccept <= pbVar5) ||
     ((((char)*pbVar5 < '0' || ('9' < (char)*pbVar5)) &&
      ((*pbVar5 != '.' || (((_yyaccept <= limit + 2 || (limit[2] < '0')) || ('9' < (char)*pbVar5))))
      )))) goto LAB_0065871d;
  goto LAB_0064c6eb;
  while( true ) {
    if (0x39 < yych_4) {
      if (0x40 < yych_4) {
        if (0x44 < yych_4) goto LAB_00658122;
        goto LAB_00657ce0;
      }
      break;
    }
    limit = (char *)pbVar5;
    if (yych_4 < 0x30) break;
LAB_00657dfc:
    pbVar5 = (byte *)(limit + 1);
    yych_4 = *pbVar5;
    if (0x45 < yych_4) {
      if (yych_4 < 0x61) {
        if (0x5a < yych_4) goto joined_r0x00657eaf;
        goto LAB_00657ce0;
      }
      if (0x65 < yych_4) goto joined_r0x00657ede;
      if (yych_4 < 0x65) goto LAB_00657ce0;
LAB_00658122:
      local_68 = 2;
      tok = limit + 2;
      yych_4 = limit[2];
      pbVar5 = (byte *)tok;
      limit = tok;
      if (yych_4 < 0x2d) {
        if (yych_4 != 0x2b) goto joined_r0x0065848b;
        goto LAB_006582ae;
      }
      if (yych_4 < 0x2e) goto LAB_006582ae;
      if (yych_4 < 0x30) goto joined_r0x0065848b;
      if (0x39 < yych_4) goto joined_r0x0065848b;
      goto LAB_006582e4;
    }
    if (yych_4 < 0x2f) {
      if (yych_4 == 0x27) goto LAB_00657ce0;
      if (0x2d < yych_4) goto LAB_0065803e;
      break;
    }
  }
  goto LAB_0065871d;
  while( true ) {
    if (yych_4 < 0x30) goto LAB_006580db;
    pbVar5 = (byte *)tok;
    if (0x39 < yych_4) break;
LAB_0065803e:
    limit = (char *)pbVar5;
    local_68 = 1;
    tok = limit + 1;
    yych_4 = *tok;
    if (0x45 < yych_4) {
      if (yych_4 < 0x65) {
        limit = tok;
        if (yych_4 < 0x47) goto LAB_0065828c;
        goto LAB_006580db;
      }
      if (yych_4 < 0x66) goto LAB_00658232;
      limit = tok;
      if (yych_4 < 0x67) goto LAB_0065828c;
      goto LAB_006580db;
    }
  }
  if (yych_4 < 0x45) {
LAB_006580db:
    pbVar5 = (byte *)tok;
  }
  else {
LAB_00658232:
    pcVar9 = limit + 2;
    yych_4 = limit[2];
    limit = pcVar9;
    if (yych_4 < 0x2d) {
      if (yych_4 == 0x2b) {
LAB_006582ae:
        yych_4 = limit[1];
        if ((0x2f < yych_4) && (limit = limit + 1, yych_4 < 0x3a)) goto LAB_00658406;
      }
LAB_00657fe5:
      limit = tok;
      pbVar5 = (byte *)tok;
      if ((local_68 < 2) && (pbVar5 = (byte *)limit, local_68 != 0)) goto LAB_006580db;
    }
    else {
      if (yych_4 < 0x2e) goto LAB_006582ae;
      if ((yych_4 < 0x30) || (0x39 < yych_4)) goto LAB_00657fe5;
LAB_00658406:
      while( true ) {
        limit = limit + 1;
        yych_4 = *limit;
        pbVar5 = (byte *)limit;
        if (0x45 < yych_4) break;
        if ((yych_4 < 0x30) || (0x39 < yych_4)) goto LAB_0065871d;
      }
      if ((yych_4 < 0x47) || (yych_4 == 0x66)) {
LAB_0065828c:
        pbVar5 = (byte *)(limit + 1);
      }
    }
  }
  goto LAB_0065871d;
  while( true ) {
    if (0x39 < yych_4) {
      if (0x40 < yych_4) {
        if (yych_4 == 0x46) goto LAB_0065846f;
        goto LAB_00657ce0;
      }
      break;
    }
    if (yych_4 == 0x27) goto LAB_00657ce0;
    limit = (char *)pbVar5;
    if (yych_4 < 0x30) break;
LAB_006582e4:
    pbVar5 = (byte *)(limit + 1);
    yych_4 = *pbVar5;
    if (0x5a < yych_4) {
      if (0x65 < yych_4) {
        if (0x66 < yych_4) goto joined_r0x00657ede;
LAB_0065846f:
        yych_4 = limit[2];
        pbVar5 = (byte *)(limit + 2);
        goto joined_r0x0065848b;
      }
      if ((yych_4 == 0x5f) || (0x60 < yych_4)) goto LAB_00657ce0;
      break;
    }
  }
  goto LAB_0065871d;
  while (yych_4 < 0x21) {
LAB_00657c0c:
    limit = limit + 1;
    yych_4 = *limit;
    if (yych_4 == 10) break;
  }
  goto LAB_0064c6e3;
LAB_006589f4:
  if (_yyaccept <= limit) goto LAB_00658b7a;
  if ((((this->Escape & 1U) == 0) || (*limit != '\\')) || (limit[1] != '\"')) {
    if ((*limit == '\r') && (limit[1] == '\n')) {
      limit = limit + 1;
    }
    else if (*limit == '\"') goto LAB_00658b7a;
  }
  else {
    limit = limit + 1;
  }
  if (*limit == '\n') {
    if ((this->CMode & 1U) != 0) {
      if ((((this->Escape & 1U) == 0) || (this->StringLen == 0)) ||
         (this->String[this->StringLen + -1] != '\\')) {
        ScriptError(this,"Unterminated string constant");
      }
      else {
        this->StringLen = this->StringLen + -1;
      }
    }
    this->Line = this->Line + 1;
    this->Crossed = true;
  }
  if (this->StringLen == 0x80) {
    FString::AppendCStrPart(&this->BigStringBuffer,this->StringBuffer,(long)this->StringLen);
    this->StringLen = 0;
  }
  cVar1 = *limit;
  iVar8 = this->StringLen;
  this->StringLen = iVar8 + 1;
  this->StringBuffer[iVar8] = cVar1;
  limit = limit + 1;
  goto LAB_006589f4;
LAB_00658b7a:
  bVar4 = FString::IsNotEmpty(&this->BigStringBuffer);
  if ((bVar4) || (this->StringLen == 0x80)) {
    FString::AppendCStrPart(&this->BigStringBuffer,this->StringBuffer,(long)this->StringLen);
    pcVar6 = FString::LockBuffer(&this->BigStringBuffer);
    this->String = pcVar6;
    sVar7 = FString::Len(&this->BigStringBuffer);
    this->StringLen = (int)sVar7;
  }
  else {
    this->String = this->StringBuffer;
    this->StringBuffer[this->StringLen] = '\0';
  }
  this->ScriptPtr = limit + 1;
  cursor._7_1_ = true;
  goto LAB_00658c2b;
  while (yych_4 == 0x27) {
LAB_00657ce0:
    limit = (char *)pbVar5;
    yych_4 = limit[1];
    pbVar5 = (byte *)(limit + 1);
joined_r0x0065848b:
    if (0x5a < yych_4) {
      if (yych_4 < 0x61) {
joined_r0x00657eaf:
        if (yych_4 != 0x5f) break;
      }
      else {
joined_r0x00657ede:
        if ((0x7a < yych_4) && (yych_4 < 0x7f)) break;
      }
      goto LAB_00657ce0;
    }
    if (0x2f < yych_4) {
      if ((0x39 < yych_4) && (yych_4 < 0x41)) break;
      goto LAB_00657ce0;
    }
  }
LAB_0065871d:
  limit = (char *)pbVar5;
  if (limit < _yyaccept) {
    local_c8 = limit;
  }
  else {
    local_c8 = this->ScriptEndPtr;
  }
  this->ScriptPtr = local_c8;
  this->StringLen = (int)this->ScriptPtr - (int)pcVar6;
  if (((marker._7_1_ & 1) == 0) || ((this->TokenType != 0x102 && (this->TokenType != 0x103)))) {
    if (this->StringLen < 0x80) {
      memcpy(this->StringBuffer,pcVar6,(long)this->StringLen);
    }
    else {
      FString::FString(local_90,pcVar6,(long)this->StringLen);
      FString::operator=(&this->BigStringBuffer,local_90);
      FString::~FString(local_90);
    }
  }
  else {
    this->StringLen = this->StringLen + -2;
    if (this->StringLen < 0x80) {
      memcpy(this->StringBuffer,pcVar6 + 1,(long)this->StringLen);
    }
    else {
      FString::FString(&local_78,pcVar6 + 1,(long)this->StringLen);
      FString::operator=(&this->BigStringBuffer,&local_78);
      FString::~FString(&local_78);
    }
    if ((this->StateMode != '\0') && (this->TokenType == 0x102)) {
      this->TokenType = 0x107;
    }
  }
  if (((marker._7_1_ & 1) != 0) && (this->StateMode != '\0')) {
    if (this->TokenType == 0x107) {
      this->StateMode = this->StateMode + 0xff;
    }
    else {
      this->StateMode = '\x02';
    }
  }
  if (this->StringLen < 0x80) {
    this->String = this->StringBuffer;
    this->StringBuffer[this->StringLen] = '\0';
  }
  else {
    pcVar6 = FString::LockBuffer(&this->BigStringBuffer);
    this->String = pcVar6;
  }
  cursor._7_1_ = true;
LAB_00658c2b:
  this->LastGotToken = (bool)(marker._7_1_ & 1);
  return cursor._7_1_;
}

Assistant:

bool FScanner::ScanString (bool tokens)
{
	const char *marker, *tok;
	bool return_val;

	CheckOpen();
	if (AlreadyGot)
	{
		AlreadyGot = false;
		if (!tokens || LastGotToken)
		{
			return true;
		}
		ScriptPtr = LastGotPtr;
		Line = LastGotLine;
	}

	Crossed = false;
	if (ScriptPtr >= ScriptEndPtr)
	{
		End = true;
		return false;
	}

	LastGotPtr = ScriptPtr;
	LastGotLine = Line;

	// In case the generated scanner does not use marker, avoid compiler warnings.
	marker;
#include "sc_man_scanner.h"
	LastGotToken = tokens;
	return return_val;
}